

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Globals.cpp
# Opt level: O3

void __thiscall OpenMD::Globals::Globals(Globals *this)

{
  ParamMap *this_00;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  FluctuatingChargeParameters *this_02;
  RNEMDParameters *this_03;
  LightParameters *this_04;
  MinimizerParameters *this_05;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  local_790;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_768;
  size_type local_760;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_758;
  ParameterBase *local_748;
  ParameterBase *local_740;
  string *local_738;
  ParameterBase *local_730;
  ParameterBase *local_728;
  string *local_720;
  ParameterBase *local_718;
  string *local_710;
  ParameterBase *local_708;
  string *local_700;
  ParameterBase *local_6f8;
  string *local_6f0;
  ParameterBase *local_6e8;
  string *local_6e0;
  ParameterBase *local_6d8;
  ParameterBase *local_6d0;
  string *local_6c8;
  ParameterBase *local_6c0;
  string *local_6b8;
  ParameterBase *local_6b0;
  string *local_6a8;
  ParameterBase *local_6a0;
  string *local_698;
  ParameterBase *local_690;
  string *local_688;
  ParameterBase *local_680;
  string *local_678;
  ParameterBase *local_670;
  string *local_668;
  ParameterBase *local_660;
  string *local_658;
  ParameterBase *local_650;
  string *local_648;
  ParameterBase *local_640;
  string *local_638;
  ParameterBase *local_630;
  string *local_628;
  ParameterBase *local_620;
  string *local_618;
  ParameterBase *local_610;
  ParameterBase *local_608;
  ParameterBase *local_600;
  string *local_5f8;
  ParameterBase *local_5f0;
  string *local_5e8;
  ParameterBase *local_5e0;
  string *local_5d8;
  ParameterBase *local_5d0;
  string *local_5c8;
  ParameterBase *local_5c0;
  string *local_5b8;
  ParameterBase *local_5b0;
  string *local_5a8;
  ParameterBase *local_5a0;
  string *local_598;
  ParameterBase *local_590;
  string *local_588;
  ParameterBase *local_580;
  string *local_578;
  ParameterBase *local_570;
  string *local_568;
  ParameterBase *local_560;
  string *local_558;
  ParameterBase *local_550;
  string *local_548;
  ParameterBase *local_540;
  string *local_538;
  ParameterBase *local_530;
  string *local_528;
  ParameterBase *local_520;
  string *local_518;
  ParameterBase *local_510;
  string *local_508;
  ParameterBase *local_500;
  ParameterBase *local_4f8;
  string *local_4f0;
  ParameterBase *local_4e8;
  string *local_4e0;
  ParameterBase *local_4d8;
  string *local_4d0;
  ParameterBase *local_4c8;
  string *local_4c0;
  ParameterBase *local_4b8;
  string *local_4b0;
  ParameterBase *local_4a8;
  string *local_4a0;
  ParameterBase *local_498;
  ParameterBase *local_490;
  ParameterBase *local_488;
  string *local_480;
  ParameterBase *local_478;
  string *local_470;
  ParameterBase *local_468;
  ParameterBase *local_460;
  ParameterBase *local_458;
  string *local_450;
  ParameterBase *local_448;
  ParameterBase *local_440;
  ParameterBase *local_438;
  ParameterBase *local_430;
  string *local_428;
  ParameterBase *local_420;
  string *local_418;
  ParameterBase *local_410;
  string *local_408;
  ParameterBase *local_400;
  string *local_3f8;
  ParameterBase *local_3f0;
  ParameterBase *local_3e8;
  ParameterBase *local_3e0;
  string *local_3d8;
  ParameterBase *local_3d0;
  string *local_3c8;
  ParameterBase *local_3c0;
  string *local_3b8;
  ParameterBase *local_3b0;
  string *local_3a8;
  ParameterBase *local_3a0;
  string *local_398;
  ParameterBase *local_390;
  string *local_388;
  ParameterBase *local_380;
  ParameterBase *local_378;
  string *local_370;
  ParameterBase *local_368;
  string *local_360;
  ParameterBase *local_358;
  string *local_350;
  ParameterBase *local_348;
  string *local_340;
  ParameterBase *local_338;
  string *local_330;
  ParameterBase *local_328;
  string *local_320;
  ParameterBase *local_318;
  string *local_310;
  ParameterBase *local_308;
  string *local_300;
  ParameterBase *local_2f8;
  string *local_2f0;
  ParameterBase *local_2e8;
  string *local_2e0;
  ParameterBase *local_2d8;
  string *local_2d0;
  ParameterBase *local_2c8;
  string *local_2c0;
  ParameterBase *local_2b8;
  string *local_2b0;
  ParameterBase *local_2a8;
  ParameterBase *local_2a0;
  string *local_298;
  ParameterBase *local_290;
  string *local_288;
  ParameterBase *local_280;
  ParameterBase *local_278;
  string *local_270;
  ParameterBase *local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  p_Var1 = &(this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header;
  (this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header;
  (this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_header._M_color
       = _S_red;
  (this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  (this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_header._M_left
       = &p_Var1->_M_header;
  (this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_header._M_right
       = &p_Var1->_M_header;
  (this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->super_DataHolder)._vptr_DataHolder = (_func_int **)&PTR__Globals_002f8b18;
  (this->ForceField).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->ForceField).super_ParameterBase.keyword_.field_2;
  (this->ForceField).super_ParameterBase.keyword_._M_string_length = 0;
  (this->ForceField).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->ForceField).super_ParameterBase.optional_ = false;
  (this->ForceField).super_ParameterBase.defaultValue_ = false;
  (this->ForceField).super_ParameterBase.empty_ = true;
  (this->ForceField).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__Parameter_002f7390;
  (this->ForceField).data_._M_dataplus._M_p = (pointer)&(this->ForceField).data_.field_2;
  (this->ForceField).data_._M_string_length = 0;
  (this->ForceField).data_.field_2._M_local_buf[0] = '\0';
  local_38 = &(this->TargetTemp).super_ParameterBase.keyword_.field_2;
  (this->TargetTemp).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_38;
  (this->TargetTemp).super_ParameterBase.keyword_._M_string_length = 0;
  (this->TargetTemp).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->TargetTemp).super_ParameterBase.optional_ = false;
  (this->TargetTemp).super_ParameterBase.defaultValue_ = false;
  (this->TargetTemp).super_ParameterBase.empty_ = true;
  (this->TargetTemp).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7c98;
  (this->Ensemble).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->Ensemble).super_ParameterBase.keyword_.field_2;
  (this->Ensemble).super_ParameterBase.keyword_._M_string_length = 0;
  (this->Ensemble).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->Ensemble).super_ParameterBase.optional_ = false;
  (this->Ensemble).super_ParameterBase.defaultValue_ = false;
  (this->Ensemble).super_ParameterBase.empty_ = true;
  (this->Ensemble).super_ParameterBase._vptr_ParameterBase = (_func_int **)&PTR__Parameter_002f7390;
  (this->Ensemble).data_._M_dataplus._M_p = (pointer)&(this->Ensemble).data_.field_2;
  (this->Ensemble).data_._M_string_length = 0;
  (this->Ensemble).data_.field_2._M_local_buf[0] = '\0';
  local_40 = &(this->Dt).super_ParameterBase.keyword_.field_2;
  (this->Dt).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_40;
  (this->Dt).super_ParameterBase.keyword_._M_string_length = 0;
  (this->Dt).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->Dt).super_ParameterBase.optional_ = false;
  (this->Dt).super_ParameterBase.defaultValue_ = false;
  (this->Dt).super_ParameterBase.empty_ = true;
  (this->Dt).super_ParameterBase._vptr_ParameterBase = (_func_int **)&PTR__ParameterBase_002f7c98;
  local_48 = &(this->RunTime).super_ParameterBase.keyword_.field_2;
  (this->RunTime).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_48;
  (this->RunTime).super_ParameterBase.keyword_._M_string_length = 0;
  (this->RunTime).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->RunTime).super_ParameterBase.optional_ = false;
  (this->RunTime).super_ParameterBase.defaultValue_ = false;
  (this->RunTime).super_ParameterBase.empty_ = true;
  (this->RunTime).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7c98;
  (this->FinalConfig).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->FinalConfig).super_ParameterBase.keyword_.field_2;
  (this->FinalConfig).super_ParameterBase.keyword_._M_string_length = 0;
  (this->FinalConfig).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->FinalConfig).super_ParameterBase.optional_ = false;
  (this->FinalConfig).super_ParameterBase.defaultValue_ = false;
  (this->FinalConfig).super_ParameterBase.empty_ = true;
  (this->FinalConfig).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__Parameter_002f7390;
  (this->FinalConfig).data_._M_dataplus._M_p = (pointer)&(this->FinalConfig).data_.field_2;
  (this->FinalConfig).data_._M_string_length = 0;
  (this->FinalConfig).data_.field_2._M_local_buf[0] = '\0';
  local_50 = &(this->SampleTime).super_ParameterBase.keyword_.field_2;
  (this->SampleTime).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_50;
  (this->SampleTime).super_ParameterBase.keyword_._M_string_length = 0;
  (this->SampleTime).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->SampleTime).super_ParameterBase.optional_ = false;
  (this->SampleTime).super_ParameterBase.defaultValue_ = false;
  (this->SampleTime).super_ParameterBase.empty_ = true;
  (this->SampleTime).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7c98;
  local_58 = &(this->ResetTime).super_ParameterBase.keyword_.field_2;
  (this->ResetTime).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_58;
  (this->ResetTime).super_ParameterBase.keyword_._M_string_length = 0;
  (this->ResetTime).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->ResetTime).super_ParameterBase.optional_ = false;
  (this->ResetTime).super_ParameterBase.defaultValue_ = false;
  (this->ResetTime).super_ParameterBase.empty_ = true;
  (this->ResetTime).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7c98;
  local_60 = &(this->StatusTime).super_ParameterBase.keyword_.field_2;
  (this->StatusTime).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_60;
  (this->StatusTime).super_ParameterBase.keyword_._M_string_length = 0;
  (this->StatusTime).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->StatusTime).super_ParameterBase.optional_ = false;
  (this->StatusTime).super_ParameterBase.defaultValue_ = false;
  (this->StatusTime).super_ParameterBase.empty_ = true;
  (this->StatusTime).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7c98;
  local_68 = &(this->CutoffRadius).super_ParameterBase.keyword_.field_2;
  (this->CutoffRadius).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_68;
  (this->CutoffRadius).super_ParameterBase.keyword_._M_string_length = 0;
  (this->CutoffRadius).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->CutoffRadius).super_ParameterBase.optional_ = false;
  (this->CutoffRadius).super_ParameterBase.defaultValue_ = false;
  (this->CutoffRadius).super_ParameterBase.empty_ = true;
  (this->CutoffRadius).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7c98;
  local_70 = &(this->SwitchingRadius).super_ParameterBase.keyword_.field_2;
  (this->SwitchingRadius).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_70;
  (this->SwitchingRadius).super_ParameterBase.keyword_._M_string_length = 0;
  (this->SwitchingRadius).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->SwitchingRadius).super_ParameterBase.optional_ = false;
  (this->SwitchingRadius).super_ParameterBase.defaultValue_ = false;
  (this->SwitchingRadius).super_ParameterBase.empty_ = true;
  (this->SwitchingRadius).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7c98;
  local_78 = &(this->TempSet).super_ParameterBase.keyword_.field_2;
  (this->TempSet).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_78;
  (this->TempSet).super_ParameterBase.keyword_._M_string_length = 0;
  (this->TempSet).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->TempSet).super_ParameterBase.optional_ = false;
  (this->TempSet).super_ParameterBase.defaultValue_ = false;
  (this->TempSet).super_ParameterBase.empty_ = true;
  (this->TempSet).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7c20;
  local_80 = &(this->ThermalTime).super_ParameterBase.keyword_.field_2;
  (this->ThermalTime).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_80;
  (this->ThermalTime).super_ParameterBase.keyword_._M_string_length = 0;
  (this->ThermalTime).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->ThermalTime).super_ParameterBase.optional_ = false;
  (this->ThermalTime).super_ParameterBase.defaultValue_ = false;
  (this->ThermalTime).super_ParameterBase.empty_ = true;
  (this->ThermalTime).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7c98;
  local_88 = &(this->UsePeriodicBoundaryConditions).super_ParameterBase.keyword_.field_2;
  (this->UsePeriodicBoundaryConditions).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)local_88;
  (this->UsePeriodicBoundaryConditions).super_ParameterBase.keyword_._M_string_length = 0;
  (this->UsePeriodicBoundaryConditions).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->UsePeriodicBoundaryConditions).super_ParameterBase.optional_ = false;
  (this->UsePeriodicBoundaryConditions).super_ParameterBase.defaultValue_ = false;
  (this->UsePeriodicBoundaryConditions).super_ParameterBase.empty_ = true;
  (this->UsePeriodicBoundaryConditions).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7c20;
  local_90 = &(this->ConserveLinearMomentum).super_ParameterBase.keyword_.field_2;
  (this->ConserveLinearMomentum).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_90;
  (this->ConserveLinearMomentum).super_ParameterBase.keyword_._M_string_length = 0;
  (this->ConserveLinearMomentum).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->ConserveLinearMomentum).super_ParameterBase.optional_ = false;
  (this->ConserveLinearMomentum).super_ParameterBase.defaultValue_ = false;
  (this->ConserveLinearMomentum).super_ParameterBase.empty_ = true;
  (this->ConserveLinearMomentum).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7c20;
  local_98 = &(this->ConserveAngularMomentum).super_ParameterBase.keyword_.field_2;
  (this->ConserveAngularMomentum).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_98;
  (this->ConserveAngularMomentum).super_ParameterBase.keyword_._M_string_length = 0;
  (this->ConserveAngularMomentum).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->ConserveAngularMomentum).super_ParameterBase.optional_ = false;
  (this->ConserveAngularMomentum).super_ParameterBase.defaultValue_ = false;
  (this->ConserveAngularMomentum).super_ParameterBase.empty_ = true;
  (this->ConserveAngularMomentum).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7c20;
  local_a0 = &(this->TargetPressure).super_ParameterBase.keyword_.field_2;
  (this->TargetPressure).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_a0;
  (this->TargetPressure).super_ParameterBase.keyword_._M_string_length = 0;
  (this->TargetPressure).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->TargetPressure).super_ParameterBase.optional_ = false;
  (this->TargetPressure).super_ParameterBase.defaultValue_ = false;
  (this->TargetPressure).super_ParameterBase.empty_ = true;
  (this->TargetPressure).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7c98;
  local_a8 = &(this->UseAtomicVirial).super_ParameterBase.keyword_.field_2;
  (this->UseAtomicVirial).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_a8;
  (this->UseAtomicVirial).super_ParameterBase.keyword_._M_string_length = 0;
  (this->UseAtomicVirial).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->UseAtomicVirial).super_ParameterBase.optional_ = false;
  (this->UseAtomicVirial).super_ParameterBase.defaultValue_ = false;
  (this->UseAtomicVirial).super_ParameterBase.empty_ = true;
  (this->UseAtomicVirial).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7c20;
  local_b0 = &(this->UseLongRangeCorrections).super_ParameterBase.keyword_.field_2;
  (this->UseLongRangeCorrections).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_b0;
  (this->UseLongRangeCorrections).super_ParameterBase.keyword_._M_string_length = 0;
  (this->UseLongRangeCorrections).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->UseLongRangeCorrections).super_ParameterBase.optional_ = false;
  (this->UseLongRangeCorrections).super_ParameterBase.defaultValue_ = false;
  (this->UseLongRangeCorrections).super_ParameterBase.empty_ = true;
  (this->UseLongRangeCorrections).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7c20;
  local_b8 = &(this->TauThermostat).super_ParameterBase.keyword_.field_2;
  (this->TauThermostat).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_b8;
  (this->TauThermostat).super_ParameterBase.keyword_._M_string_length = 0;
  (this->TauThermostat).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->TauThermostat).super_ParameterBase.optional_ = false;
  (this->TauThermostat).super_ParameterBase.defaultValue_ = false;
  (this->TauThermostat).super_ParameterBase.empty_ = true;
  (this->TauThermostat).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7c98;
  local_c0 = &(this->TauBarostat).super_ParameterBase.keyword_.field_2;
  (this->TauBarostat).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_c0;
  (this->TauBarostat).super_ParameterBase.keyword_._M_string_length = 0;
  (this->TauBarostat).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->TauBarostat).super_ParameterBase.optional_ = false;
  (this->TauBarostat).super_ParameterBase.defaultValue_ = false;
  (this->TauBarostat).super_ParameterBase.empty_ = true;
  (this->TauBarostat).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7c98;
  local_c8 = &(this->LangevinPistonDrag).super_ParameterBase.keyword_.field_2;
  (this->LangevinPistonDrag).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_c8;
  (this->LangevinPistonDrag).super_ParameterBase.keyword_._M_string_length = 0;
  (this->LangevinPistonDrag).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->LangevinPistonDrag).super_ParameterBase.optional_ = false;
  (this->LangevinPistonDrag).super_ParameterBase.defaultValue_ = false;
  (this->LangevinPistonDrag).super_ParameterBase.empty_ = true;
  (this->LangevinPistonDrag).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7c98;
  local_d0 = &(this->ZconsTime).super_ParameterBase.keyword_.field_2;
  (this->ZconsTime).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_d0;
  (this->ZconsTime).super_ParameterBase.keyword_._M_string_length = 0;
  (this->ZconsTime).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->ZconsTime).super_ParameterBase.optional_ = false;
  (this->ZconsTime).super_ParameterBase.defaultValue_ = false;
  (this->ZconsTime).super_ParameterBase.empty_ = true;
  (this->ZconsTime).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7c98;
  local_d8 = &(this->ZconsTol).super_ParameterBase.keyword_.field_2;
  (this->ZconsTol).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_d8;
  (this->ZconsTol).super_ParameterBase.keyword_._M_string_length = 0;
  (this->ZconsTol).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->ZconsTol).super_ParameterBase.optional_ = false;
  (this->ZconsTol).super_ParameterBase.defaultValue_ = false;
  (this->ZconsTol).super_ParameterBase.empty_ = true;
  (this->ZconsTol).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7c98;
  (this->ZconsForcePolicy).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->ZconsForcePolicy).super_ParameterBase.keyword_.field_2;
  (this->ZconsForcePolicy).super_ParameterBase.keyword_._M_string_length = 0;
  (this->ZconsForcePolicy).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->ZconsForcePolicy).super_ParameterBase.optional_ = false;
  (this->ZconsForcePolicy).super_ParameterBase.defaultValue_ = false;
  (this->ZconsForcePolicy).super_ParameterBase.empty_ = true;
  (this->ZconsForcePolicy).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__Parameter_002f7390;
  (this->ZconsForcePolicy).data_._M_dataplus._M_p = (pointer)&(this->ZconsForcePolicy).data_.field_2
  ;
  (this->ZconsForcePolicy).data_._M_string_length = 0;
  (this->ZconsForcePolicy).data_.field_2._M_local_buf[0] = '\0';
  local_e0 = &(this->Seed).super_ParameterBase.keyword_.field_2;
  (this->Seed).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_e0;
  (this->Seed).super_ParameterBase.keyword_._M_string_length = 0;
  (this->Seed).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->Seed).super_ParameterBase.optional_ = false;
  (this->Seed).super_ParameterBase.defaultValue_ = false;
  (this->Seed).super_ParameterBase.empty_ = true;
  (this->Seed).super_ParameterBase._vptr_ParameterBase = (_func_int **)&PTR__ParameterBase_002f8b58;
  local_e8 = &(this->UseInitalTime).super_ParameterBase.keyword_.field_2;
  (this->UseInitalTime).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_e8;
  (this->UseInitalTime).super_ParameterBase.keyword_._M_string_length = 0;
  (this->UseInitalTime).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->UseInitalTime).super_ParameterBase.optional_ = false;
  (this->UseInitalTime).super_ParameterBase.defaultValue_ = false;
  (this->UseInitalTime).super_ParameterBase.empty_ = true;
  (this->UseInitalTime).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7c20;
  local_f0 = &(this->UseIntialExtendedSystemState).super_ParameterBase.keyword_.field_2;
  (this->UseIntialExtendedSystemState).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)local_f0;
  (this->UseIntialExtendedSystemState).super_ParameterBase.keyword_._M_string_length = 0;
  (this->UseIntialExtendedSystemState).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->UseIntialExtendedSystemState).super_ParameterBase.optional_ = false;
  (this->UseIntialExtendedSystemState).super_ParameterBase.defaultValue_ = false;
  (this->UseIntialExtendedSystemState).super_ParameterBase.empty_ = true;
  (this->UseIntialExtendedSystemState).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7c20;
  local_f8 = &(this->OrthoBoxTolerance).super_ParameterBase.keyword_.field_2;
  (this->OrthoBoxTolerance).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_f8;
  (this->OrthoBoxTolerance).super_ParameterBase.keyword_._M_string_length = 0;
  (this->OrthoBoxTolerance).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->OrthoBoxTolerance).super_ParameterBase.optional_ = false;
  (this->OrthoBoxTolerance).super_ParameterBase.defaultValue_ = false;
  (this->OrthoBoxTolerance).super_ParameterBase.empty_ = true;
  (this->OrthoBoxTolerance).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7c98;
  local_100 = &(this->ZconsGap).super_ParameterBase.keyword_.field_2;
  (this->ZconsGap).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_100;
  (this->ZconsGap).super_ParameterBase.keyword_._M_string_length = 0;
  (this->ZconsGap).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->ZconsGap).super_ParameterBase.optional_ = false;
  (this->ZconsGap).super_ParameterBase.defaultValue_ = false;
  (this->ZconsGap).super_ParameterBase.empty_ = true;
  (this->ZconsGap).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7c98;
  local_108 = &(this->ZconsFixtime).super_ParameterBase.keyword_.field_2;
  (this->ZconsFixtime).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_108;
  (this->ZconsFixtime).super_ParameterBase.keyword_._M_string_length = 0;
  (this->ZconsFixtime).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->ZconsFixtime).super_ParameterBase.optional_ = false;
  (this->ZconsFixtime).super_ParameterBase.defaultValue_ = false;
  (this->ZconsFixtime).super_ParameterBase.empty_ = true;
  (this->ZconsFixtime).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7c98;
  local_110 = &(this->ZconsUsingSMD).super_ParameterBase.keyword_.field_2;
  (this->ZconsUsingSMD).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_110;
  (this->ZconsUsingSMD).super_ParameterBase.keyword_._M_string_length = 0;
  (this->ZconsUsingSMD).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->ZconsUsingSMD).super_ParameterBase.optional_ = false;
  (this->ZconsUsingSMD).super_ParameterBase.defaultValue_ = false;
  (this->ZconsUsingSMD).super_ParameterBase.empty_ = true;
  (this->ZconsUsingSMD).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7c20;
  local_118 = &(this->UseThermodynamicIntegration).super_ParameterBase.keyword_.field_2;
  (this->UseThermodynamicIntegration).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)local_118;
  (this->UseThermodynamicIntegration).super_ParameterBase.keyword_._M_string_length = 0;
  (this->UseThermodynamicIntegration).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->UseThermodynamicIntegration).super_ParameterBase.optional_ = false;
  (this->UseThermodynamicIntegration).super_ParameterBase.defaultValue_ = false;
  (this->UseThermodynamicIntegration).super_ParameterBase.empty_ = true;
  (this->UseThermodynamicIntegration).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7c20;
  local_120 = &(this->ThermodynamicIntegrationLambda).super_ParameterBase.keyword_.field_2;
  (this->ThermodynamicIntegrationLambda).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)local_120;
  (this->ThermodynamicIntegrationLambda).super_ParameterBase.keyword_._M_string_length = 0;
  (this->ThermodynamicIntegrationLambda).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0'
  ;
  (this->ThermodynamicIntegrationLambda).super_ParameterBase.optional_ = false;
  (this->ThermodynamicIntegrationLambda).super_ParameterBase.defaultValue_ = false;
  (this->ThermodynamicIntegrationLambda).super_ParameterBase.empty_ = true;
  (this->ThermodynamicIntegrationLambda).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7c98;
  local_128 = &(this->ThermodynamicIntegrationK).super_ParameterBase.keyword_.field_2;
  (this->ThermodynamicIntegrationK).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)local_128;
  (this->ThermodynamicIntegrationK).super_ParameterBase.keyword_._M_string_length = 0;
  (this->ThermodynamicIntegrationK).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->ThermodynamicIntegrationK).super_ParameterBase.optional_ = false;
  (this->ThermodynamicIntegrationK).super_ParameterBase.defaultValue_ = false;
  (this->ThermodynamicIntegrationK).super_ParameterBase.empty_ = true;
  (this->ThermodynamicIntegrationK).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7c98;
  (this->ForceFieldVariant).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->ForceFieldVariant).super_ParameterBase.keyword_.field_2;
  (this->ForceFieldVariant).super_ParameterBase.keyword_._M_string_length = 0;
  (this->ForceFieldVariant).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->ForceFieldVariant).super_ParameterBase.optional_ = false;
  (this->ForceFieldVariant).super_ParameterBase.defaultValue_ = false;
  (this->ForceFieldVariant).super_ParameterBase.empty_ = true;
  (this->ForceFieldVariant).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__Parameter_002f7390;
  (this->ForceFieldVariant).data_._M_dataplus._M_p =
       (pointer)&(this->ForceFieldVariant).data_.field_2;
  (this->ForceFieldVariant).data_._M_string_length = 0;
  (this->ForceFieldVariant).data_.field_2._M_local_buf[0] = '\0';
  (this->ForceFieldFileName).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->ForceFieldFileName).super_ParameterBase.keyword_.field_2;
  (this->ForceFieldFileName).super_ParameterBase.keyword_._M_string_length = 0;
  (this->ForceFieldFileName).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->ForceFieldFileName).super_ParameterBase.optional_ = false;
  (this->ForceFieldFileName).super_ParameterBase.defaultValue_ = false;
  (this->ForceFieldFileName).super_ParameterBase.empty_ = true;
  (this->ForceFieldFileName).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__Parameter_002f7390;
  (this->ForceFieldFileName).data_._M_dataplus._M_p =
       (pointer)&(this->ForceFieldFileName).data_.field_2;
  (this->ForceFieldFileName).data_._M_string_length = 0;
  (this->ForceFieldFileName).data_.field_2._M_local_buf[0] = '\0';
  local_130 = &(this->SurfaceTension).super_ParameterBase.keyword_.field_2;
  (this->SurfaceTension).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_130;
  (this->SurfaceTension).super_ParameterBase.keyword_._M_string_length = 0;
  (this->SurfaceTension).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->SurfaceTension).super_ParameterBase.optional_ = false;
  (this->SurfaceTension).super_ParameterBase.defaultValue_ = false;
  (this->SurfaceTension).super_ParameterBase.empty_ = true;
  (this->SurfaceTension).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7c98;
  local_138 = &(this->PrintPressureTensor).super_ParameterBase.keyword_.field_2;
  (this->PrintPressureTensor).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_138;
  (this->PrintPressureTensor).super_ParameterBase.keyword_._M_string_length = 0;
  (this->PrintPressureTensor).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->PrintPressureTensor).super_ParameterBase.optional_ = false;
  (this->PrintPressureTensor).super_ParameterBase.defaultValue_ = false;
  (this->PrintPressureTensor).super_ParameterBase.empty_ = true;
  (this->PrintPressureTensor).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7c20;
  local_140 = &(this->PrintVirialTensor).super_ParameterBase.keyword_.field_2;
  (this->PrintVirialTensor).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_140;
  (this->PrintVirialTensor).super_ParameterBase.keyword_._M_string_length = 0;
  (this->PrintVirialTensor).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->PrintVirialTensor).super_ParameterBase.optional_ = false;
  (this->PrintVirialTensor).super_ParameterBase.defaultValue_ = false;
  (this->PrintVirialTensor).super_ParameterBase.empty_ = true;
  (this->PrintVirialTensor).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7c20;
  local_148 = &(this->PrintHeatFlux).super_ParameterBase.keyword_.field_2;
  (this->PrintHeatFlux).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_148;
  (this->PrintHeatFlux).super_ParameterBase.keyword_._M_string_length = 0;
  (this->PrintHeatFlux).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->PrintHeatFlux).super_ParameterBase.optional_ = false;
  (this->PrintHeatFlux).super_ParameterBase.defaultValue_ = false;
  (this->PrintHeatFlux).super_ParameterBase.empty_ = true;
  (this->PrintHeatFlux).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7c20;
  local_150 = &(this->TaggedAtomPair).super_ParameterBase.keyword_.field_2;
  (this->TaggedAtomPair).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_150;
  (this->TaggedAtomPair).super_ParameterBase.keyword_._M_string_length = 0;
  (this->TaggedAtomPair).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->TaggedAtomPair).super_ParameterBase.optional_ = false;
  (this->TaggedAtomPair).super_ParameterBase.defaultValue_ = false;
  (this->TaggedAtomPair).super_ParameterBase.empty_ = true;
  (this->TaggedAtomPair).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f8bd0;
  *(undefined8 *)&(this->TaggedAtomPair).super_ParameterBase.field_0x2c = 0;
  local_158 = &(this->PrintTaggedPairDistance).super_ParameterBase.keyword_.field_2;
  (this->PrintTaggedPairDistance).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_158
  ;
  (this->PrintTaggedPairDistance).super_ParameterBase.keyword_._M_string_length = 0;
  (this->PrintTaggedPairDistance).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->PrintTaggedPairDistance).super_ParameterBase.optional_ = false;
  (this->PrintTaggedPairDistance).super_ParameterBase.defaultValue_ = false;
  (this->PrintTaggedPairDistance).super_ParameterBase.empty_ = true;
  (this->PrintTaggedPairDistance).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7c20;
  (this->ElectrostaticSummationMethod).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->ElectrostaticSummationMethod).super_ParameterBase.keyword_.field_2;
  (this->ElectrostaticSummationMethod).super_ParameterBase.keyword_._M_string_length = 0;
  (this->ElectrostaticSummationMethod).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->ElectrostaticSummationMethod).super_ParameterBase.optional_ = false;
  (this->ElectrostaticSummationMethod).super_ParameterBase.defaultValue_ = false;
  (this->ElectrostaticSummationMethod).super_ParameterBase.empty_ = true;
  (this->ElectrostaticSummationMethod).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__Parameter_002f7390;
  (this->ElectrostaticSummationMethod).data_._M_dataplus._M_p =
       (pointer)&(this->ElectrostaticSummationMethod).data_.field_2;
  (this->ElectrostaticSummationMethod).data_._M_string_length = 0;
  (this->ElectrostaticSummationMethod).data_.field_2._M_local_buf[0] = '\0';
  (this->ElectrostaticScreeningMethod).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->ElectrostaticScreeningMethod).super_ParameterBase.keyword_.field_2;
  (this->ElectrostaticScreeningMethod).super_ParameterBase.keyword_._M_string_length = 0;
  (this->ElectrostaticScreeningMethod).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->ElectrostaticScreeningMethod).super_ParameterBase.optional_ = false;
  (this->ElectrostaticScreeningMethod).super_ParameterBase.defaultValue_ = false;
  (this->ElectrostaticScreeningMethod).super_ParameterBase.empty_ = true;
  (this->ElectrostaticScreeningMethod).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__Parameter_002f7390;
  (this->ElectrostaticScreeningMethod).data_._M_dataplus._M_p =
       (pointer)&(this->ElectrostaticScreeningMethod).data_.field_2;
  (this->ElectrostaticScreeningMethod).data_._M_string_length = 0;
  (this->ElectrostaticScreeningMethod).data_.field_2._M_local_buf[0] = '\0';
  local_160 = &(this->UseSurfaceTerm).super_ParameterBase.keyword_.field_2;
  (this->UseSurfaceTerm).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_160;
  (this->UseSurfaceTerm).super_ParameterBase.keyword_._M_string_length = 0;
  (this->UseSurfaceTerm).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->UseSurfaceTerm).super_ParameterBase.optional_ = false;
  (this->UseSurfaceTerm).super_ParameterBase.defaultValue_ = false;
  (this->UseSurfaceTerm).super_ParameterBase.empty_ = true;
  (this->UseSurfaceTerm).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7c20;
  local_168 = &(this->UseSlabGeometry).super_ParameterBase.keyword_.field_2;
  (this->UseSlabGeometry).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_168;
  (this->UseSlabGeometry).super_ParameterBase.keyword_._M_string_length = 0;
  (this->UseSlabGeometry).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->UseSlabGeometry).super_ParameterBase.optional_ = false;
  (this->UseSlabGeometry).super_ParameterBase.defaultValue_ = false;
  (this->UseSlabGeometry).super_ParameterBase.empty_ = true;
  (this->UseSlabGeometry).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7c20;
  local_170 = &(this->DampingAlpha).super_ParameterBase.keyword_.field_2;
  (this->DampingAlpha).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_170;
  (this->DampingAlpha).super_ParameterBase.keyword_._M_string_length = 0;
  (this->DampingAlpha).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->DampingAlpha).super_ParameterBase.optional_ = false;
  (this->DampingAlpha).super_ParameterBase.defaultValue_ = false;
  (this->DampingAlpha).super_ParameterBase.empty_ = true;
  (this->DampingAlpha).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7c98;
  local_178 = &(this->Dielectric).super_ParameterBase.keyword_.field_2;
  (this->Dielectric).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_178;
  (this->Dielectric).super_ParameterBase.keyword_._M_string_length = 0;
  (this->Dielectric).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->Dielectric).super_ParameterBase.optional_ = false;
  (this->Dielectric).super_ParameterBase.defaultValue_ = false;
  (this->Dielectric).super_ParameterBase.empty_ = true;
  (this->Dielectric).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7c98;
  (this->CutoffMethod).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->CutoffMethod).super_ParameterBase.keyword_.field_2;
  (this->CutoffMethod).super_ParameterBase.keyword_._M_string_length = 0;
  (this->CutoffMethod).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->CutoffMethod).super_ParameterBase.optional_ = false;
  (this->CutoffMethod).super_ParameterBase.defaultValue_ = false;
  (this->CutoffMethod).super_ParameterBase.empty_ = true;
  (this->CutoffMethod).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__Parameter_002f7390;
  (this->CutoffMethod).data_._M_dataplus._M_p = (pointer)&(this->CutoffMethod).data_.field_2;
  (this->CutoffMethod).data_._M_string_length = 0;
  (this->CutoffMethod).data_.field_2._M_local_buf[0] = '\0';
  (this->SwitchingFunctionType).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->SwitchingFunctionType).super_ParameterBase.keyword_.field_2;
  (this->SwitchingFunctionType).super_ParameterBase.keyword_._M_string_length = 0;
  (this->SwitchingFunctionType).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->SwitchingFunctionType).super_ParameterBase.optional_ = false;
  (this->SwitchingFunctionType).super_ParameterBase.defaultValue_ = false;
  (this->SwitchingFunctionType).super_ParameterBase.empty_ = true;
  (this->SwitchingFunctionType).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__Parameter_002f7390;
  (this->SwitchingFunctionType).data_._M_dataplus._M_p =
       (pointer)&(this->SwitchingFunctionType).data_.field_2;
  (this->SwitchingFunctionType).data_._M_string_length = 0;
  (this->SwitchingFunctionType).data_.field_2._M_local_buf[0] = '\0';
  local_180 = &(this->CompressDumpFile).super_ParameterBase.keyword_.field_2;
  (this->CompressDumpFile).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_180;
  (this->CompressDumpFile).super_ParameterBase.keyword_._M_string_length = 0;
  (this->CompressDumpFile).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->CompressDumpFile).super_ParameterBase.optional_ = false;
  (this->CompressDumpFile).super_ParameterBase.defaultValue_ = false;
  (this->CompressDumpFile).super_ParameterBase.empty_ = true;
  (this->CompressDumpFile).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7c20;
  local_188 = &(this->OutputForceVector).super_ParameterBase.keyword_.field_2;
  (this->OutputForceVector).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_188;
  (this->OutputForceVector).super_ParameterBase.keyword_._M_string_length = 0;
  (this->OutputForceVector).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->OutputForceVector).super_ParameterBase.optional_ = false;
  (this->OutputForceVector).super_ParameterBase.defaultValue_ = false;
  (this->OutputForceVector).super_ParameterBase.empty_ = true;
  (this->OutputForceVector).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7c20;
  local_190 = &(this->OutputParticlePotential).super_ParameterBase.keyword_.field_2;
  (this->OutputParticlePotential).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_190
  ;
  (this->OutputParticlePotential).super_ParameterBase.keyword_._M_string_length = 0;
  (this->OutputParticlePotential).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->OutputParticlePotential).super_ParameterBase.optional_ = false;
  (this->OutputParticlePotential).super_ParameterBase.defaultValue_ = false;
  (this->OutputParticlePotential).super_ParameterBase.empty_ = true;
  (this->OutputParticlePotential).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7c20;
  local_198 = &(this->OutputElectricField).super_ParameterBase.keyword_.field_2;
  (this->OutputElectricField).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_198;
  (this->OutputElectricField).super_ParameterBase.keyword_._M_string_length = 0;
  (this->OutputElectricField).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->OutputElectricField).super_ParameterBase.optional_ = false;
  (this->OutputElectricField).super_ParameterBase.defaultValue_ = false;
  (this->OutputElectricField).super_ParameterBase.empty_ = true;
  (this->OutputElectricField).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7c20;
  local_1a0 = &(this->OutputFluctuatingCharges).super_ParameterBase.keyword_.field_2;
  (this->OutputFluctuatingCharges).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)local_1a0;
  (this->OutputFluctuatingCharges).super_ParameterBase.keyword_._M_string_length = 0;
  (this->OutputFluctuatingCharges).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->OutputFluctuatingCharges).super_ParameterBase.optional_ = false;
  (this->OutputFluctuatingCharges).super_ParameterBase.defaultValue_ = false;
  (this->OutputFluctuatingCharges).super_ParameterBase.empty_ = true;
  (this->OutputFluctuatingCharges).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7c20;
  local_1a8 = &(this->OutputSitePotential).super_ParameterBase.keyword_.field_2;
  (this->OutputSitePotential).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_1a8;
  (this->OutputSitePotential).super_ParameterBase.keyword_._M_string_length = 0;
  (this->OutputSitePotential).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->OutputSitePotential).super_ParameterBase.optional_ = false;
  (this->OutputSitePotential).super_ParameterBase.defaultValue_ = false;
  (this->OutputSitePotential).super_ParameterBase.empty_ = true;
  (this->OutputSitePotential).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7c20;
  local_1b0 = &(this->OutputDensity).super_ParameterBase.keyword_.field_2;
  (this->OutputDensity).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_1b0;
  (this->OutputDensity).super_ParameterBase.keyword_._M_string_length = 0;
  (this->OutputDensity).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->OutputDensity).super_ParameterBase.optional_ = false;
  (this->OutputDensity).super_ParameterBase.defaultValue_ = false;
  (this->OutputDensity).super_ParameterBase.empty_ = true;
  (this->OutputDensity).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7c20;
  local_1b8 = &(this->SkinThickness).super_ParameterBase.keyword_.field_2;
  (this->SkinThickness).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_1b8;
  (this->SkinThickness).super_ParameterBase.keyword_._M_string_length = 0;
  (this->SkinThickness).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->SkinThickness).super_ParameterBase.optional_ = false;
  (this->SkinThickness).super_ParameterBase.defaultValue_ = false;
  (this->SkinThickness).super_ParameterBase.empty_ = true;
  (this->SkinThickness).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7c98;
  (this->StatFileFormat).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->StatFileFormat).super_ParameterBase.keyword_.field_2;
  (this->StatFileFormat).super_ParameterBase.keyword_._M_string_length = 0;
  (this->StatFileFormat).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->StatFileFormat).super_ParameterBase.optional_ = false;
  (this->StatFileFormat).super_ParameterBase.defaultValue_ = false;
  (this->StatFileFormat).super_ParameterBase.empty_ = true;
  (this->StatFileFormat).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__Parameter_002f7390;
  (this->StatFileFormat).data_._M_dataplus._M_p = (pointer)&(this->StatFileFormat).data_.field_2;
  (this->StatFileFormat).data_._M_string_length = 0;
  (this->StatFileFormat).data_.field_2._M_local_buf[0] = '\0';
  local_1c0 = &(this->StatFilePrecision).super_ParameterBase.keyword_.field_2;
  (this->StatFilePrecision).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_1c0;
  (this->StatFilePrecision).super_ParameterBase.keyword_._M_string_length = 0;
  (this->StatFilePrecision).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->StatFilePrecision).super_ParameterBase.optional_ = false;
  (this->StatFilePrecision).super_ParameterBase.defaultValue_ = false;
  (this->StatFilePrecision).super_ParameterBase.empty_ = true;
  (this->StatFilePrecision).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7d10;
  (this->HydroPropFile).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->HydroPropFile).super_ParameterBase.keyword_.field_2;
  (this->HydroPropFile).super_ParameterBase.keyword_._M_string_length = 0;
  (this->HydroPropFile).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->HydroPropFile).super_ParameterBase.optional_ = false;
  (this->HydroPropFile).super_ParameterBase.defaultValue_ = false;
  (this->HydroPropFile).super_ParameterBase.empty_ = true;
  (this->HydroPropFile).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__Parameter_002f7390;
  (this->HydroPropFile).data_._M_dataplus._M_p = (pointer)&(this->HydroPropFile).data_.field_2;
  (this->HydroPropFile).data_._M_string_length = 0;
  (this->HydroPropFile).data_.field_2._M_local_buf[0] = '\0';
  local_1c8 = &(this->Viscosity).super_ParameterBase.keyword_.field_2;
  (this->Viscosity).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_1c8;
  (this->Viscosity).super_ParameterBase.keyword_._M_string_length = 0;
  (this->Viscosity).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->Viscosity).super_ParameterBase.optional_ = false;
  (this->Viscosity).super_ParameterBase.defaultValue_ = false;
  (this->Viscosity).super_ParameterBase.empty_ = true;
  (this->Viscosity).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7c98;
  local_1d0 = &(this->BeadSize).super_ParameterBase.keyword_.field_2;
  (this->BeadSize).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_1d0;
  (this->BeadSize).super_ParameterBase.keyword_._M_string_length = 0;
  (this->BeadSize).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->BeadSize).super_ParameterBase.optional_ = false;
  (this->BeadSize).super_ParameterBase.defaultValue_ = false;
  (this->BeadSize).super_ParameterBase.empty_ = true;
  (this->BeadSize).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7c98;
  local_1d8 = &(this->UseSphericalBoundaryConditions).super_ParameterBase.keyword_.field_2;
  (this->UseSphericalBoundaryConditions).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)local_1d8;
  (this->UseSphericalBoundaryConditions).super_ParameterBase.keyword_._M_string_length = 0;
  (this->UseSphericalBoundaryConditions).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0'
  ;
  (this->UseSphericalBoundaryConditions).super_ParameterBase.optional_ = false;
  (this->UseSphericalBoundaryConditions).super_ParameterBase.defaultValue_ = false;
  (this->UseSphericalBoundaryConditions).super_ParameterBase.empty_ = true;
  (this->UseSphericalBoundaryConditions).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7c20;
  local_1e0 = &(this->SkipPairLoop).super_ParameterBase.keyword_.field_2;
  (this->SkipPairLoop).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_1e0;
  (this->SkipPairLoop).super_ParameterBase.keyword_._M_string_length = 0;
  (this->SkipPairLoop).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->SkipPairLoop).super_ParameterBase.optional_ = false;
  (this->SkipPairLoop).super_ParameterBase.defaultValue_ = false;
  (this->SkipPairLoop).super_ParameterBase.empty_ = true;
  (this->SkipPairLoop).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7c20;
  local_1e8 = &(this->FrozenBufferRadius).super_ParameterBase.keyword_.field_2;
  (this->FrozenBufferRadius).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_1e8;
  (this->FrozenBufferRadius).super_ParameterBase.keyword_._M_string_length = 0;
  (this->FrozenBufferRadius).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->FrozenBufferRadius).super_ParameterBase.optional_ = false;
  (this->FrozenBufferRadius).super_ParameterBase.defaultValue_ = false;
  (this->FrozenBufferRadius).super_ParameterBase.empty_ = true;
  (this->FrozenBufferRadius).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7c98;
  local_1f0 = &(this->LangevinBufferRadius).super_ParameterBase.keyword_.field_2;
  (this->LangevinBufferRadius).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_1f0;
  (this->LangevinBufferRadius).super_ParameterBase.keyword_._M_string_length = 0;
  (this->LangevinBufferRadius).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->LangevinBufferRadius).super_ParameterBase.optional_ = false;
  (this->LangevinBufferRadius).super_ParameterBase.defaultValue_ = false;
  (this->LangevinBufferRadius).super_ParameterBase.empty_ = true;
  (this->LangevinBufferRadius).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7c98;
  local_1f8 = &(this->AccumulateBoxDipole).super_ParameterBase.keyword_.field_2;
  (this->AccumulateBoxDipole).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_1f8;
  (this->AccumulateBoxDipole).super_ParameterBase.keyword_._M_string_length = 0;
  (this->AccumulateBoxDipole).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->AccumulateBoxDipole).super_ParameterBase.optional_ = false;
  (this->AccumulateBoxDipole).super_ParameterBase.defaultValue_ = false;
  (this->AccumulateBoxDipole).super_ParameterBase.empty_ = true;
  (this->AccumulateBoxDipole).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7c20;
  local_200 = &(this->AccumulateBoxQuadrupole).super_ParameterBase.keyword_.field_2;
  (this->AccumulateBoxQuadrupole).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_200
  ;
  (this->AccumulateBoxQuadrupole).super_ParameterBase.keyword_._M_string_length = 0;
  (this->AccumulateBoxQuadrupole).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->AccumulateBoxQuadrupole).super_ParameterBase.optional_ = false;
  (this->AccumulateBoxQuadrupole).super_ParameterBase.defaultValue_ = false;
  (this->AccumulateBoxQuadrupole).super_ParameterBase.empty_ = true;
  (this->AccumulateBoxQuadrupole).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7c20;
  local_208 = &(this->NeighborListNeighbors).super_ParameterBase.keyword_.field_2;
  (this->NeighborListNeighbors).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_208;
  (this->NeighborListNeighbors).super_ParameterBase.keyword_._M_string_length = 0;
  (this->NeighborListNeighbors).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->NeighborListNeighbors).super_ParameterBase.optional_ = false;
  (this->NeighborListNeighbors).super_ParameterBase.defaultValue_ = false;
  (this->NeighborListNeighbors).super_ParameterBase.empty_ = true;
  (this->NeighborListNeighbors).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7d10;
  local_210 = &(this->UseMultipleTemperatureMethod).super_ParameterBase.keyword_.field_2;
  (this->UseMultipleTemperatureMethod).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)local_210;
  (this->UseMultipleTemperatureMethod).super_ParameterBase.keyword_._M_string_length = 0;
  (this->UseMultipleTemperatureMethod).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->UseMultipleTemperatureMethod).super_ParameterBase.optional_ = false;
  (this->UseMultipleTemperatureMethod).super_ParameterBase.defaultValue_ = false;
  (this->UseMultipleTemperatureMethod).super_ParameterBase.empty_ = true;
  (this->UseMultipleTemperatureMethod).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7c20;
  local_218 = &(this->MTM_Ce).super_ParameterBase.keyword_.field_2;
  (this->MTM_Ce).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_218;
  (this->MTM_Ce).super_ParameterBase.keyword_._M_string_length = 0;
  (this->MTM_Ce).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->MTM_Ce).super_ParameterBase.optional_ = false;
  (this->MTM_Ce).super_ParameterBase.defaultValue_ = false;
  (this->MTM_Ce).super_ParameterBase.empty_ = true;
  (this->MTM_Ce).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7c98;
  local_220 = &(this->MTM_G).super_ParameterBase.keyword_.field_2;
  (this->MTM_G).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_220;
  (this->MTM_G).super_ParameterBase.keyword_._M_string_length = 0;
  (this->MTM_G).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->MTM_G).super_ParameterBase.optional_ = false;
  (this->MTM_G).super_ParameterBase.defaultValue_ = false;
  (this->MTM_G).super_ParameterBase.empty_ = true;
  (this->MTM_G).super_ParameterBase._vptr_ParameterBase = (_func_int **)&PTR__ParameterBase_002f7c98
  ;
  local_228 = &(this->MTM_Io).super_ParameterBase.keyword_.field_2;
  (this->MTM_Io).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_228;
  (this->MTM_Io).super_ParameterBase.keyword_._M_string_length = 0;
  (this->MTM_Io).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->MTM_Io).super_ParameterBase.optional_ = false;
  (this->MTM_Io).super_ParameterBase.defaultValue_ = false;
  (this->MTM_Io).super_ParameterBase.empty_ = true;
  (this->MTM_Io).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7c98;
  local_230 = &(this->MTM_Sigma).super_ParameterBase.keyword_.field_2;
  (this->MTM_Sigma).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_230;
  (this->MTM_Sigma).super_ParameterBase.keyword_._M_string_length = 0;
  (this->MTM_Sigma).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->MTM_Sigma).super_ParameterBase.optional_ = false;
  (this->MTM_Sigma).super_ParameterBase.defaultValue_ = false;
  (this->MTM_Sigma).super_ParameterBase.empty_ = true;
  (this->MTM_Sigma).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7c98;
  local_238 = &(this->MTM_R).super_ParameterBase.keyword_.field_2;
  (this->MTM_R).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_238;
  (this->MTM_R).super_ParameterBase.keyword_._M_string_length = 0;
  (this->MTM_R).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->MTM_R).super_ParameterBase.optional_ = false;
  (this->MTM_R).super_ParameterBase.defaultValue_ = false;
  (this->MTM_R).super_ParameterBase.empty_ = true;
  (this->MTM_R).super_ParameterBase._vptr_ParameterBase = (_func_int **)&PTR__ParameterBase_002f7c98
  ;
  local_240 = &(this->UseRestraints).super_ParameterBase.keyword_.field_2;
  (this->UseRestraints).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_240;
  (this->UseRestraints).super_ParameterBase.keyword_._M_string_length = 0;
  (this->UseRestraints).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->UseRestraints).super_ParameterBase.optional_ = false;
  (this->UseRestraints).super_ParameterBase.defaultValue_ = false;
  (this->UseRestraints).super_ParameterBase.empty_ = true;
  (this->UseRestraints).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7c20;
  (this->Restraint_file).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->Restraint_file).super_ParameterBase.keyword_.field_2;
  (this->Restraint_file).super_ParameterBase.keyword_._M_string_length = 0;
  (this->Restraint_file).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->Restraint_file).super_ParameterBase.optional_ = false;
  (this->Restraint_file).super_ParameterBase.defaultValue_ = false;
  (this->Restraint_file).super_ParameterBase.empty_ = true;
  (this->Restraint_file).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__Parameter_002f7390;
  (this->Restraint_file).data_._M_dataplus._M_p = (pointer)&(this->Restraint_file).data_.field_2;
  (this->Restraint_file).data_._M_string_length = 0;
  (this->Restraint_file).data_.field_2._M_local_buf[0] = '\0';
  (this->HULL_Method).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->HULL_Method).super_ParameterBase.keyword_.field_2;
  (this->HULL_Method).super_ParameterBase.keyword_._M_string_length = 0;
  (this->HULL_Method).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->HULL_Method).super_ParameterBase.optional_ = false;
  (this->HULL_Method).super_ParameterBase.defaultValue_ = false;
  (this->HULL_Method).super_ParameterBase.empty_ = true;
  (this->HULL_Method).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__Parameter_002f7390;
  (this->HULL_Method).data_._M_dataplus._M_p = (pointer)&(this->HULL_Method).data_.field_2;
  (this->HULL_Method).data_._M_string_length = 0;
  (this->HULL_Method).data_.field_2._M_local_buf[0] = '\0';
  local_248 = &(this->Alpha).super_ParameterBase.keyword_.field_2;
  (this->Alpha).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_248;
  (this->Alpha).super_ParameterBase.keyword_._M_string_length = 0;
  (this->Alpha).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->Alpha).super_ParameterBase.optional_ = false;
  (this->Alpha).super_ParameterBase.defaultValue_ = false;
  (this->Alpha).super_ParameterBase.empty_ = true;
  (this->Alpha).super_ParameterBase._vptr_ParameterBase = (_func_int **)&PTR__ParameterBase_002f7c98
  ;
  local_250 = &(this->MDfileVersion).super_ParameterBase.keyword_.field_2;
  (this->MDfileVersion).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_250;
  (this->MDfileVersion).super_ParameterBase.keyword_._M_string_length = 0;
  (this->MDfileVersion).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->MDfileVersion).super_ParameterBase.optional_ = false;
  (this->MDfileVersion).super_ParameterBase.defaultValue_ = false;
  (this->MDfileVersion).super_ParameterBase.empty_ = true;
  (this->MDfileVersion).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7d10;
  (this->UniformField).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->UniformField).super_ParameterBase.keyword_.field_2;
  (this->UniformField).super_ParameterBase.keyword_._M_string_length = 0;
  (this->UniformField).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->UniformField).super_ParameterBase.optional_ = false;
  (this->UniformField).super_ParameterBase.defaultValue_ = false;
  (this->UniformField).super_ParameterBase.empty_ = true;
  (this->UniformField).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__Parameter_002f8c48;
  (this->UniformField).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->UniformField).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->UniformField).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->MagneticField).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->MagneticField).super_ParameterBase.keyword_.field_2;
  (this->MagneticField).super_ParameterBase.keyword_._M_string_length = 0;
  (this->MagneticField).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->MagneticField).super_ParameterBase.optional_ = false;
  (this->MagneticField).super_ParameterBase.defaultValue_ = false;
  (this->MagneticField).super_ParameterBase.empty_ = true;
  (this->MagneticField).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__Parameter_002f8c48;
  (this->MagneticField).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->MagneticField).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->MagneticField).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_258 = &(this->UniformGradientStrength).super_ParameterBase.keyword_.field_2;
  (this->UniformGradientStrength).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_258
  ;
  (this->UniformGradientStrength).super_ParameterBase.keyword_._M_string_length = 0;
  (this->UniformGradientStrength).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->UniformGradientStrength).super_ParameterBase.optional_ = false;
  (this->UniformGradientStrength).super_ParameterBase.defaultValue_ = false;
  (this->UniformGradientStrength).super_ParameterBase.empty_ = true;
  (this->UniformGradientStrength).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7c98;
  (this->UniformGradientDirection1).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->UniformGradientDirection1).super_ParameterBase.keyword_.field_2;
  (this->UniformGradientDirection1).super_ParameterBase.keyword_._M_string_length = 0;
  (this->UniformGradientDirection1).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->UniformGradientDirection1).super_ParameterBase.optional_ = false;
  (this->UniformGradientDirection1).super_ParameterBase.defaultValue_ = false;
  (this->UniformGradientDirection1).super_ParameterBase.empty_ = true;
  (this->UniformGradientDirection1).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__Parameter_002f8c48;
  (this->UniformGradientDirection1).data_.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->UniformGradientDirection1).data_.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->UniformGradientDirection1).data_.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->UniformGradientDirection2).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->UniformGradientDirection2).super_ParameterBase.keyword_.field_2;
  (this->UniformGradientDirection2).super_ParameterBase.keyword_._M_string_length = 0;
  (this->UniformGradientDirection2).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->UniformGradientDirection2).super_ParameterBase.optional_ = false;
  (this->UniformGradientDirection2).super_ParameterBase.defaultValue_ = false;
  (this->UniformGradientDirection2).super_ParameterBase.empty_ = true;
  (this->UniformGradientDirection2).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__Parameter_002f8c48;
  (this->UniformGradientDirection2).data_.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->UniformGradientDirection2).data_.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->UniformGradientDirection2).data_.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ElectricField).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->ElectricField).super_ParameterBase.keyword_.field_2;
  (this->ElectricField).super_ParameterBase.keyword_._M_string_length = 0;
  (this->ElectricField).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->ElectricField).super_ParameterBase.optional_ = false;
  (this->ElectricField).super_ParameterBase.defaultValue_ = false;
  (this->ElectricField).super_ParameterBase.empty_ = true;
  (this->ElectricField).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__Parameter_002f8c48;
  (this->ElectricField).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ElectricField).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ElectricField).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_260 = &(this->ConstraintTime).super_ParameterBase.keyword_.field_2;
  (this->ConstraintTime).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_260;
  (this->ConstraintTime).super_ParameterBase.keyword_._M_string_length = 0;
  (this->ConstraintTime).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->ConstraintTime).super_ParameterBase.optional_ = false;
  (this->ConstraintTime).super_ParameterBase.defaultValue_ = false;
  (this->ConstraintTime).super_ParameterBase.empty_ = true;
  (this->ConstraintTime).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f7c98;
  (this->PotentialSelection).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->PotentialSelection).super_ParameterBase.keyword_.field_2;
  (this->PotentialSelection).super_ParameterBase.keyword_._M_string_length = 0;
  (this->PotentialSelection).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->PotentialSelection).super_ParameterBase.optional_ = false;
  (this->PotentialSelection).super_ParameterBase.defaultValue_ = false;
  (this->PotentialSelection).super_ParameterBase.empty_ = true;
  (this->PotentialSelection).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__Parameter_002f7390;
  (this->PotentialSelection).data_._M_dataplus._M_p =
       (pointer)&(this->PotentialSelection).data_.field_2;
  (this->PotentialSelection).data_._M_string_length = 0;
  (this->PotentialSelection).data_.field_2._M_local_buf[0] = '\0';
  (this->PrivilegedAxis).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->PrivilegedAxis).super_ParameterBase.keyword_.field_2;
  (this->PrivilegedAxis).super_ParameterBase.keyword_._M_string_length = 0;
  (this->PrivilegedAxis).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->PrivilegedAxis).super_ParameterBase.optional_ = false;
  (this->PrivilegedAxis).super_ParameterBase.defaultValue_ = false;
  (this->PrivilegedAxis).super_ParameterBase.empty_ = true;
  (this->PrivilegedAxis).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__Parameter_002f7390;
  (this->PrivilegedAxis).data_._M_dataplus._M_p = (pointer)&(this->PrivilegedAxis).data_.field_2;
  (this->PrivilegedAxis).data_._M_string_length = 0;
  (this->PrivilegedAxis).data_.field_2._M_local_buf[0] = '\0';
  (this->moleculeStamps_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->moleculeStamps_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->restraints_).
  super__Vector_base<OpenMD::RestraintStamp_*,_std::allocator<OpenMD::RestraintStamp_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->restraints_).
  super__Vector_base<OpenMD::RestraintStamp_*,_std::allocator<OpenMD::RestraintStamp_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->restraints_).
  super__Vector_base<OpenMD::RestraintStamp_*,_std::allocator<OpenMD::RestraintStamp_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->zconstraints_).
  super__Vector_base<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->zconstraints_).
  super__Vector_base<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->components_).super__Vector_base<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->zconstraints_).
  super__Vector_base<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->components_).super__Vector_base<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->components_).super__Vector_base<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var1 = &(this->moleculeStamps_)._M_t._M_impl.super__Rb_tree_header;
  (this->moleculeStamps_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->moleculeStamps_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->moleculeStamps_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->fragmentStamps_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->fragmentStamps_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->fragmentStamps_)._M_t._M_impl.super__Rb_tree_header;
  (this->fragmentStamps_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->fragmentStamps_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->fragmentStamps_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->taggedAtomPair_).first = 0;
  (this->taggedAtomPair_).second = 0;
  local_268 = &(this->ForceField).super_ParameterBase;
  local_278 = &(this->TargetTemp).super_ParameterBase;
  local_270 = (string *)&(this->TargetTemp).super_ParameterBase.keyword_;
  local_280 = &(this->Ensemble).super_ParameterBase;
  local_290 = &(this->Dt).super_ParameterBase;
  local_288 = (string *)&(this->Dt).super_ParameterBase.keyword_;
  local_2a0 = &(this->RunTime).super_ParameterBase;
  local_298 = (string *)&(this->RunTime).super_ParameterBase.keyword_;
  local_2a8 = &(this->FinalConfig).super_ParameterBase;
  local_2b8 = &(this->SampleTime).super_ParameterBase;
  local_2b0 = (string *)&(this->SampleTime).super_ParameterBase.keyword_;
  local_2c8 = &(this->ResetTime).super_ParameterBase;
  local_2c0 = (string *)&(this->ResetTime).super_ParameterBase.keyword_;
  local_2d8 = &(this->StatusTime).super_ParameterBase;
  local_2d0 = (string *)&(this->StatusTime).super_ParameterBase.keyword_;
  local_2e8 = &(this->CutoffRadius).super_ParameterBase;
  local_2e0 = (string *)&(this->CutoffRadius).super_ParameterBase.keyword_;
  local_2f8 = &(this->SwitchingRadius).super_ParameterBase;
  local_2f0 = (string *)&(this->SwitchingRadius).super_ParameterBase.keyword_;
  local_308 = &(this->TempSet).super_ParameterBase;
  local_300 = (string *)&(this->TempSet).super_ParameterBase.keyword_;
  local_318 = &(this->ThermalTime).super_ParameterBase;
  local_310 = (string *)&(this->ThermalTime).super_ParameterBase.keyword_;
  local_590 = &(this->UsePeriodicBoundaryConditions).super_ParameterBase;
  local_588 = (string *)&(this->UsePeriodicBoundaryConditions).super_ParameterBase.keyword_;
  local_5a0 = &(this->ConserveLinearMomentum).super_ParameterBase;
  local_598 = (string *)&(this->ConserveLinearMomentum).super_ParameterBase.keyword_;
  local_5b0 = &(this->ConserveAngularMomentum).super_ParameterBase;
  local_5a8 = (string *)&(this->ConserveAngularMomentum).super_ParameterBase.keyword_;
  local_328 = &(this->TargetPressure).super_ParameterBase;
  local_320 = (string *)&(this->TargetPressure).super_ParameterBase.keyword_;
  local_5c0 = &(this->UseAtomicVirial).super_ParameterBase;
  local_5b8 = (string *)&(this->UseAtomicVirial).super_ParameterBase.keyword_;
  local_5d0 = &(this->UseLongRangeCorrections).super_ParameterBase;
  local_5c8 = (string *)&(this->UseLongRangeCorrections).super_ParameterBase.keyword_;
  local_338 = &(this->TauThermostat).super_ParameterBase;
  local_330 = (string *)&(this->TauThermostat).super_ParameterBase.keyword_;
  local_348 = &(this->TauBarostat).super_ParameterBase;
  local_340 = (string *)&(this->TauBarostat).super_ParameterBase.keyword_;
  local_358 = &(this->LangevinPistonDrag).super_ParameterBase;
  local_350 = (string *)&(this->LangevinPistonDrag).super_ParameterBase.keyword_;
  local_368 = &(this->ZconsTime).super_ParameterBase;
  local_360 = (string *)&(this->ZconsTime).super_ParameterBase.keyword_;
  local_378 = &(this->ZconsTol).super_ParameterBase;
  local_370 = (string *)&(this->ZconsTol).super_ParameterBase.keyword_;
  local_380 = &(this->ZconsForcePolicy).super_ParameterBase;
  local_390 = &(this->Seed).super_ParameterBase;
  local_388 = (string *)&(this->Seed).super_ParameterBase.keyword_;
  local_5e0 = &(this->UseInitalTime).super_ParameterBase;
  local_5d8 = (string *)&(this->UseInitalTime).super_ParameterBase.keyword_;
  local_5f0 = &(this->UseIntialExtendedSystemState).super_ParameterBase;
  local_5e8 = (string *)&(this->UseIntialExtendedSystemState).super_ParameterBase.keyword_;
  local_600 = &(this->OrthoBoxTolerance).super_ParameterBase;
  local_5f8 = (string *)&(this->OrthoBoxTolerance).super_ParameterBase.keyword_;
  local_3a0 = &(this->ZconsGap).super_ParameterBase;
  local_398 = (string *)&(this->ZconsGap).super_ParameterBase.keyword_;
  local_3b0 = &(this->ZconsFixtime).super_ParameterBase;
  local_3a8 = (string *)&(this->ZconsFixtime).super_ParameterBase.keyword_;
  local_3c0 = &(this->ZconsUsingSMD).super_ParameterBase;
  local_3b8 = (string *)&(this->ZconsUsingSMD).super_ParameterBase.keyword_;
  local_740 = &(this->UseThermodynamicIntegration).super_ParameterBase;
  local_738 = (string *)&(this->UseThermodynamicIntegration).super_ParameterBase.keyword_;
  local_3d0 = &(this->ThermodynamicIntegrationLambda).super_ParameterBase;
  local_3c8 = (string *)&(this->ThermodynamicIntegrationLambda).super_ParameterBase.keyword_;
  local_3e0 = &(this->ThermodynamicIntegrationK).super_ParameterBase;
  local_3d8 = (string *)&(this->ThermodynamicIntegrationK).super_ParameterBase.keyword_;
  local_3e8 = &(this->ForceFieldVariant).super_ParameterBase;
  local_3f0 = &(this->ForceFieldFileName).super_ParameterBase;
  local_410 = &(this->SurfaceTension).super_ParameterBase;
  local_408 = (string *)&(this->SurfaceTension).super_ParameterBase.keyword_;
  local_420 = &(this->PrintPressureTensor).super_ParameterBase;
  local_418 = (string *)&(this->PrintPressureTensor).super_ParameterBase.keyword_;
  local_430 = &(this->PrintVirialTensor).super_ParameterBase;
  local_428 = (string *)&(this->PrintVirialTensor).super_ParameterBase.keyword_;
  local_660 = &(this->PrintHeatFlux).super_ParameterBase;
  local_658 = (string *)&(this->PrintHeatFlux).super_ParameterBase.keyword_;
  local_478 = &(this->TaggedAtomPair).super_ParameterBase;
  local_470 = (string *)&(this->TaggedAtomPair).super_ParameterBase.keyword_;
  local_488 = &(this->PrintTaggedPairDistance).super_ParameterBase;
  local_480 = (string *)&(this->PrintTaggedPairDistance).super_ParameterBase.keyword_;
  local_500 = &(this->ElectrostaticSummationMethod).super_ParameterBase;
  local_610 = &(this->ElectrostaticScreeningMethod).super_ParameterBase;
  local_620 = &(this->UseSurfaceTerm).super_ParameterBase;
  local_618 = (string *)&(this->UseSurfaceTerm).super_ParameterBase.keyword_;
  local_630 = &(this->UseSlabGeometry).super_ParameterBase;
  local_628 = (string *)&(this->UseSlabGeometry).super_ParameterBase.keyword_;
  local_400 = &(this->DampingAlpha).super_ParameterBase;
  local_3f8 = (string *)&(this->DampingAlpha).super_ParameterBase.keyword_;
  local_640 = &(this->Dielectric).super_ParameterBase;
  local_638 = (string *)&(this->Dielectric).super_ParameterBase.keyword_;
  local_608 = &(this->CutoffMethod).super_ParameterBase;
  local_490 = &(this->SwitchingFunctionType).super_ParameterBase;
  local_650 = &(this->CompressDumpFile).super_ParameterBase;
  local_648 = (string *)&(this->CompressDumpFile).super_ParameterBase.keyword_;
  local_670 = &(this->OutputForceVector).super_ParameterBase;
  local_668 = (string *)&(this->OutputForceVector).super_ParameterBase.keyword_;
  local_680 = &(this->OutputParticlePotential).super_ParameterBase;
  local_678 = (string *)&(this->OutputParticlePotential).super_ParameterBase.keyword_;
  local_690 = &(this->OutputElectricField).super_ParameterBase;
  local_688 = (string *)&(this->OutputElectricField).super_ParameterBase.keyword_;
  local_6a0 = &(this->OutputFluctuatingCharges).super_ParameterBase;
  local_698 = (string *)&(this->OutputFluctuatingCharges).super_ParameterBase.keyword_;
  local_6b0 = &(this->OutputSitePotential).super_ParameterBase;
  local_6a8 = (string *)&(this->OutputSitePotential).super_ParameterBase.keyword_;
  local_6c0 = &(this->OutputDensity).super_ParameterBase;
  local_6b8 = (string *)&(this->OutputDensity).super_ParameterBase.keyword_;
  local_6d0 = &(this->SkinThickness).super_ParameterBase;
  local_6c8 = (string *)&(this->SkinThickness).super_ParameterBase.keyword_;
  local_6d8 = &(this->StatFileFormat).super_ParameterBase;
  local_6e8 = &(this->StatFilePrecision).super_ParameterBase;
  local_6e0 = (string *)&(this->StatFilePrecision).super_ParameterBase.keyword_;
  local_498 = &(this->HydroPropFile).super_ParameterBase;
  local_4a8 = &(this->Viscosity).super_ParameterBase;
  local_4a0 = (string *)&(this->Viscosity).super_ParameterBase.keyword_;
  local_4b8 = &(this->BeadSize).super_ParameterBase;
  local_4b0 = (string *)&(this->BeadSize).super_ParameterBase.keyword_;
  local_6f8 = &(this->UseSphericalBoundaryConditions).super_ParameterBase;
  local_6f0 = (string *)&(this->UseSphericalBoundaryConditions).super_ParameterBase.keyword_;
  local_580 = &(this->SkipPairLoop).super_ParameterBase;
  local_578 = (string *)&(this->SkipPairLoop).super_ParameterBase.keyword_;
  local_4c8 = &(this->FrozenBufferRadius).super_ParameterBase;
  local_4c0 = (string *)&(this->FrozenBufferRadius).super_ParameterBase.keyword_;
  local_4d8 = &(this->LangevinBufferRadius).super_ParameterBase;
  local_4d0 = (string *)&(this->LangevinBufferRadius).super_ParameterBase.keyword_;
  local_708 = &(this->AccumulateBoxDipole).super_ParameterBase;
  local_700 = (string *)&(this->AccumulateBoxDipole).super_ParameterBase.keyword_;
  local_718 = &(this->AccumulateBoxQuadrupole).super_ParameterBase;
  local_710 = (string *)&(this->AccumulateBoxQuadrupole).super_ParameterBase.keyword_;
  local_4e8 = &(this->NeighborListNeighbors).super_ParameterBase;
  local_4e0 = (string *)&(this->NeighborListNeighbors).super_ParameterBase.keyword_;
  local_4f8 = &(this->UseMultipleTemperatureMethod).super_ParameterBase;
  local_4f0 = (string *)&(this->UseMultipleTemperatureMethod).super_ParameterBase.keyword_;
  local_510 = &(this->MTM_Ce).super_ParameterBase;
  local_508 = (string *)&(this->MTM_Ce).super_ParameterBase.keyword_;
  local_520 = &(this->MTM_G).super_ParameterBase;
  local_518 = (string *)&(this->MTM_G).super_ParameterBase.keyword_;
  local_530 = &(this->MTM_Io).super_ParameterBase;
  local_528 = (string *)&(this->MTM_Io).super_ParameterBase.keyword_;
  local_540 = &(this->MTM_Sigma).super_ParameterBase;
  local_538 = (string *)&(this->MTM_Sigma).super_ParameterBase.keyword_;
  local_550 = &(this->MTM_R).super_ParameterBase;
  local_548 = (string *)&(this->MTM_R).super_ParameterBase.keyword_;
  local_728 = &(this->UseRestraints).super_ParameterBase;
  local_720 = (string *)&(this->UseRestraints).super_ParameterBase.keyword_;
  local_730 = &(this->Restraint_file).super_ParameterBase;
  local_748 = &(this->HULL_Method).super_ParameterBase;
  local_560 = &(this->Alpha).super_ParameterBase;
  local_558 = (string *)&(this->Alpha).super_ParameterBase.keyword_;
  local_440 = &(this->UniformField).super_ParameterBase;
  local_448 = &(this->MagneticField).super_ParameterBase;
  local_458 = &(this->UniformGradientStrength).super_ParameterBase;
  local_450 = (string *)&(this->UniformGradientStrength).super_ParameterBase.keyword_;
  local_460 = &(this->UniformGradientDirection1).super_ParameterBase;
  local_468 = &(this->UniformGradientDirection2).super_ParameterBase;
  local_438 = &(this->ElectricField).super_ParameterBase;
  local_570 = &(this->ConstraintTime).super_ParameterBase;
  local_568 = (string *)&(this->ConstraintTime).super_ParameterBase.keyword_;
  this_02 = (FluctuatingChargeParameters *)operator_new(0x2e8);
  FluctuatingChargeParameters::FluctuatingChargeParameters(this_02);
  this->flucQpars_ = this_02;
  this_03 = (RNEMDParameters *)operator_new(0x7b0);
  RNEMD::RNEMDParameters::RNEMDParameters(this_03);
  this->rnemdPars_ = this_03;
  this_04 = (LightParameters *)operator_new(0x220);
  Perturbations::LightParameters::LightParameters(this_04);
  this->lightPars_ = this_04;
  this_05 = (MinimizerParameters *)operator_new(0x228);
  MinimizerParameters::MinimizerParameters(this_05);
  this->minimizerPars_ = this_05;
  paVar2 = &local_790.first.field_2;
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"forceField","");
  std::__cxx11::string::_M_assign((string *)&(this->ForceField).super_ParameterBase.keyword_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"forceField","");
  this_00 = &(this->super_DataHolder).parameters_;
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_268;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"targetTemp","");
  std::__cxx11::string::_M_assign(local_270);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->TargetTemp).super_ParameterBase.optional_ = true;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"targetTemp","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_278;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"ensemble","");
  std::__cxx11::string::_M_assign((string *)&(this->Ensemble).super_ParameterBase.keyword_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->Ensemble).super_ParameterBase.optional_ = true;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"ensemble","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_280;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"dt","");
  std::__cxx11::string::_M_assign(local_288);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->Dt).super_ParameterBase.optional_ = true;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"dt","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_290;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"runTime","");
  std::__cxx11::string::_M_assign(local_298);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->RunTime).super_ParameterBase.optional_ = true;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"runTime","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_2a0;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"finalConfig","");
  std::__cxx11::string::_M_assign((string *)&(this->FinalConfig).super_ParameterBase.keyword_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->FinalConfig).super_ParameterBase.optional_ = true;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"finalConfig","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_2a8;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"sampleTime","");
  std::__cxx11::string::_M_assign(local_2b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->SampleTime).super_ParameterBase.optional_ = true;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"sampleTime","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_2b8;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"resetTime","");
  std::__cxx11::string::_M_assign(local_2c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->ResetTime).super_ParameterBase.optional_ = true;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"resetTime","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_2c8;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"statusTime","");
  std::__cxx11::string::_M_assign(local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->StatusTime).super_ParameterBase.optional_ = true;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"statusTime","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_2d8;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"cutoffRadius","");
  std::__cxx11::string::_M_assign(local_2e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->CutoffRadius).super_ParameterBase.optional_ = true;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"cutoffRadius","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_2e8;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"switchingRadius","");
  std::__cxx11::string::_M_assign(local_2f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->SwitchingRadius).super_ParameterBase.optional_ = true;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"switchingRadius","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_2f8;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"tempSet","");
  std::__cxx11::string::_M_assign(local_300);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->TempSet).super_ParameterBase.optional_ = true;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"tempSet","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_308;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"thermalTime","");
  std::__cxx11::string::_M_assign(local_310);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->ThermalTime).super_ParameterBase.optional_ = true;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"thermalTime","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_318;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"targetPressure","");
  std::__cxx11::string::_M_assign(local_320);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->TargetPressure).super_ParameterBase.optional_ = true;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"targetPressure","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_328;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"tauThermostat","");
  std::__cxx11::string::_M_assign(local_330);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->TauThermostat).super_ParameterBase.optional_ = true;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"tauThermostat","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_338;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"tauBarostat","");
  std::__cxx11::string::_M_assign(local_340);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->TauBarostat).super_ParameterBase.optional_ = true;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"tauBarostat","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_348;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"langevinPistonDrag","");
  std::__cxx11::string::_M_assign(local_350);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->LangevinPistonDrag).super_ParameterBase.optional_ = true;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"langevinPistonDrag","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_358;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"zconsTime","");
  std::__cxx11::string::_M_assign(local_360);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->ZconsTime).super_ParameterBase.optional_ = true;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"zconsTime","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_368;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"zconsTol","");
  std::__cxx11::string::_M_assign(local_370);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->ZconsTol).super_ParameterBase.optional_ = true;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"zconsTol","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_378;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"zconsForcePolicy","");
  std::__cxx11::string::_M_assign((string *)&(this->ZconsForcePolicy).super_ParameterBase.keyword_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->ZconsForcePolicy).super_ParameterBase.optional_ = true;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"zconsForcePolicy","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_380;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"seed","");
  std::__cxx11::string::_M_assign(local_388);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->Seed).super_ParameterBase.optional_ = true;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"seed","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_390;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"zconsGap","");
  std::__cxx11::string::_M_assign(local_398);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->ZconsGap).super_ParameterBase.optional_ = true;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"zconsGap","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_3a0;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"zconsFixtime","");
  std::__cxx11::string::_M_assign(local_3a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->ZconsFixtime).super_ParameterBase.optional_ = true;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"zconsFixtime","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_3b0;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"zconsUsingSMD","");
  std::__cxx11::string::_M_assign(local_3b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->ZconsUsingSMD).super_ParameterBase.optional_ = true;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"zconsUsingSMD","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_3c0;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_790,"thermodynamicIntegrationLambda","");
  std::__cxx11::string::_M_assign(local_3c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->ThermodynamicIntegrationLambda).super_ParameterBase.optional_ = true;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_768,"thermodynamicIntegrationLambda","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_3d0;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_790,"thermodynamicIntegrationK","");
  std::__cxx11::string::_M_assign(local_3d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->ThermodynamicIntegrationK).super_ParameterBase.optional_ = true;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_768,"thermodynamicIntegrationK","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_3e0;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"forceFieldVariant","");
  std::__cxx11::string::_M_assign((string *)&(this->ForceFieldVariant).super_ParameterBase.keyword_)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->ForceFieldVariant).super_ParameterBase.optional_ = true;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"forceFieldVariant","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_3e8;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"forceFieldFileName","");
  std::__cxx11::string::_M_assign
            ((string *)&(this->ForceFieldFileName).super_ParameterBase.keyword_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->ForceFieldFileName).super_ParameterBase.optional_ = true;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"forceFieldFileName","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_3f0;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"dampingAlpha","");
  std::__cxx11::string::_M_assign(local_3f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->DampingAlpha).super_ParameterBase.optional_ = true;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"dampingAlpha","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_400;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"surfaceTension","");
  std::__cxx11::string::_M_assign(local_408);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->SurfaceTension).super_ParameterBase.optional_ = true;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"surfaceTension","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_410;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"printPressureTensor","");
  std::__cxx11::string::_M_assign(local_418);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->PrintPressureTensor).super_ParameterBase.optional_ = true;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"printPressureTensor","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_420;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"printVirialTensor","");
  std::__cxx11::string::_M_assign(local_428);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->PrintVirialTensor).super_ParameterBase.optional_ = true;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"printVirialTensor","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_430;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"electricField","");
  std::__cxx11::string::_M_assign((string *)&(this->ElectricField).super_ParameterBase.keyword_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->ElectricField).super_ParameterBase.optional_ = true;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"electricField","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_438;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"uniformField","");
  std::__cxx11::string::_M_assign((string *)&(this->UniformField).super_ParameterBase.keyword_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->UniformField).super_ParameterBase.optional_ = true;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"uniformField","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_440;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"magneticField","");
  std::__cxx11::string::_M_assign((string *)&(this->MagneticField).super_ParameterBase.keyword_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->MagneticField).super_ParameterBase.optional_ = true;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"magneticField","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_448;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"uniformGradientStrength","")
  ;
  std::__cxx11::string::_M_assign(local_450);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->UniformGradientStrength).super_ParameterBase.optional_ = true;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"uniformGradientStrength","")
  ;
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_458;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_790,"uniformGradientDirection1","");
  std::__cxx11::string::_M_assign
            ((string *)&(this->UniformGradientDirection1).super_ParameterBase.keyword_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->UniformGradientDirection1).super_ParameterBase.optional_ = true;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_768,"uniformGradientDirection1","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_460;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_790,"uniformGradientDirection2","");
  std::__cxx11::string::_M_assign
            ((string *)&(this->UniformGradientDirection2).super_ParameterBase.keyword_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->UniformGradientDirection2).super_ParameterBase.optional_ = true;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_768,"uniformGradientDirection2","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_468;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"taggedAtomPair","");
  std::__cxx11::string::_M_assign(local_470);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->TaggedAtomPair).super_ParameterBase.optional_ = true;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"taggedAtomPair","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_478;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"printTaggedPairDistance","")
  ;
  std::__cxx11::string::_M_assign(local_480);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->PrintTaggedPairDistance).super_ParameterBase.optional_ = true;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"printTaggedPairDistance","")
  ;
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_488;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"switchingFunctionType","");
  std::__cxx11::string::_M_assign
            ((string *)&(this->SwitchingFunctionType).super_ParameterBase.keyword_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->SwitchingFunctionType).super_ParameterBase.optional_ = true;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"switchingFunctionType","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_490;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"HydroPropFile","");
  std::__cxx11::string::_M_assign((string *)&(this->HydroPropFile).super_ParameterBase.keyword_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->HydroPropFile).super_ParameterBase.optional_ = true;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"HydroPropFile","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_498;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"viscosity","");
  std::__cxx11::string::_M_assign(local_4a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->Viscosity).super_ParameterBase.optional_ = true;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"viscosity","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_4a8;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"beadSize","");
  std::__cxx11::string::_M_assign(local_4b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->BeadSize).super_ParameterBase.optional_ = true;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"beadSize","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_4b8;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"frozenBufferRadius","");
  std::__cxx11::string::_M_assign(local_4c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->FrozenBufferRadius).super_ParameterBase.optional_ = true;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"frozenBufferRadius","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_4c8;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"langevinBufferRadius","");
  std::__cxx11::string::_M_assign(local_4d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->LangevinBufferRadius).super_ParameterBase.optional_ = true;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"langevinBufferRadius","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_4d8;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"NeighborListNeighbors","");
  std::__cxx11::string::_M_assign(local_4e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->NeighborListNeighbors).super_ParameterBase.optional_ = true;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"NeighborListNeighbors","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_4e8;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_790,"useMultipleTemperatureMethod","");
  std::__cxx11::string::_M_assign(local_4f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->UseMultipleTemperatureMethod).super_ParameterBase.optional_ = true;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_768,"useMultipleTemperatureMethod","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_4f8;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_790,"electrostaticSummationMethod","");
  std::__cxx11::string::_M_assign
            ((string *)&(this->ElectrostaticSummationMethod).super_ParameterBase.keyword_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->ElectrostaticSummationMethod).super_ParameterBase.optional_ = true;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_768,"electrostaticSummationMethod","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_500;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"MTM_Ce","");
  std::__cxx11::string::_M_assign(local_508);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->MTM_Ce).super_ParameterBase.optional_ = true;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"MTM_Ce","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_510;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"MTM_G","");
  std::__cxx11::string::_M_assign(local_518);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->MTM_G).super_ParameterBase.optional_ = true;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"MTM_G","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_520;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"MTM_Io","");
  std::__cxx11::string::_M_assign(local_528);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->MTM_Io).super_ParameterBase.optional_ = true;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"MTM_Io","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_530;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"MTM_Sigma","");
  std::__cxx11::string::_M_assign(local_538);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->MTM_Sigma).super_ParameterBase.optional_ = true;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"MTM_Sigma","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_540;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"MTM_R","");
  std::__cxx11::string::_M_assign(local_548);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->MTM_R).super_ParameterBase.optional_ = true;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"MTM_R","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_550;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"alpha","");
  std::__cxx11::string::_M_assign(local_558);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->Alpha).super_ParameterBase.optional_ = true;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"alpha","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_560;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"constraintTime","");
  std::__cxx11::string::_M_assign(local_568);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->ConstraintTime).super_ParameterBase.optional_ = true;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"constraintTime","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_570;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"potentialSelection","");
  std::__cxx11::string::_M_assign
            ((string *)&(this->PotentialSelection).super_ParameterBase.keyword_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->PotentialSelection).super_ParameterBase.optional_ = true;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"potentialSelection","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = &(this->PotentialSelection).super_ParameterBase;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"skipPairLoop","");
  std::__cxx11::string::_M_assign(local_578);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->SkipPairLoop).super_ParameterBase.optional_ = true;
  (this->SkipPairLoop).super_ParameterBase.defaultValue_ = true;
  (this->SkipPairLoop).super_ParameterBase.empty_ = false;
  (this->SkipPairLoop).super_ParameterBase.field_0x2b = 0;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"skipPairLoop","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_580;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_790,"usePeriodicBoundaryConditions","");
  std::__cxx11::string::_M_assign(local_588);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->UsePeriodicBoundaryConditions).super_ParameterBase.optional_ = true;
  (this->UsePeriodicBoundaryConditions).super_ParameterBase.defaultValue_ = true;
  (this->UsePeriodicBoundaryConditions).super_ParameterBase.empty_ = false;
  (this->UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b = 1;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_768,"usePeriodicBoundaryConditions","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_590;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"conserveLinearMomentum","");
  std::__cxx11::string::_M_assign(local_598);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->ConserveLinearMomentum).super_ParameterBase.optional_ = true;
  (this->ConserveLinearMomentum).super_ParameterBase.defaultValue_ = true;
  (this->ConserveLinearMomentum).super_ParameterBase.empty_ = false;
  (this->ConserveLinearMomentum).super_ParameterBase.field_0x2b = 1;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"conserveLinearMomentum","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_5a0;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"conserveAngularMomentum","")
  ;
  std::__cxx11::string::_M_assign(local_5a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->ConserveAngularMomentum).super_ParameterBase.optional_ = true;
  (this->ConserveAngularMomentum).super_ParameterBase.defaultValue_ = true;
  (this->ConserveAngularMomentum).super_ParameterBase.empty_ = false;
  (this->ConserveAngularMomentum).super_ParameterBase.field_0x2b = 1;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"conserveAngularMomentum","")
  ;
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_5b0;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"useAtomicVirial","");
  std::__cxx11::string::_M_assign(local_5b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->UseAtomicVirial).super_ParameterBase.optional_ = true;
  (this->UseAtomicVirial).super_ParameterBase.defaultValue_ = true;
  (this->UseAtomicVirial).super_ParameterBase.empty_ = false;
  (this->UseAtomicVirial).super_ParameterBase.field_0x2b = 1;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"useAtomicVirial","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_5c0;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"useLongRangeCorrections","")
  ;
  std::__cxx11::string::_M_assign(local_5c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->UseLongRangeCorrections).super_ParameterBase.optional_ = true;
  (this->UseLongRangeCorrections).super_ParameterBase.defaultValue_ = true;
  (this->UseLongRangeCorrections).super_ParameterBase.empty_ = false;
  (this->UseLongRangeCorrections).super_ParameterBase.field_0x2b = 1;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"useLongRangeCorrections","")
  ;
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_5d0;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"useInitialTime","");
  std::__cxx11::string::_M_assign(local_5d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->UseInitalTime).super_ParameterBase.optional_ = true;
  (this->UseInitalTime).super_ParameterBase.defaultValue_ = true;
  (this->UseInitalTime).super_ParameterBase.empty_ = false;
  (this->UseInitalTime).super_ParameterBase.field_0x2b = 0;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"useInitialTime","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_5e0;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_790,"useInitialExtendedSystemState","");
  std::__cxx11::string::_M_assign(local_5e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->UseIntialExtendedSystemState).super_ParameterBase.optional_ = true;
  (this->UseIntialExtendedSystemState).super_ParameterBase.defaultValue_ = true;
  (this->UseIntialExtendedSystemState).super_ParameterBase.empty_ = false;
  (this->UseIntialExtendedSystemState).super_ParameterBase.field_0x2b = 0;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_768,"useInitialExtendedSystemState","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_5f0;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"orthoBoxTolerance","");
  std::__cxx11::string::_M_assign(local_5f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->OrthoBoxTolerance).super_ParameterBase.optional_ = true;
  (this->OrthoBoxTolerance).super_ParameterBase.defaultValue_ = true;
  (this->OrthoBoxTolerance).data_ = 1e-06;
  (this->OrthoBoxTolerance).super_ParameterBase.empty_ = false;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"orthoBoxTolerance","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_600;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"cutoffMethod","");
  std::__cxx11::string::_M_assign((string *)&(this->CutoffMethod).super_ParameterBase.keyword_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->CutoffMethod).super_ParameterBase.optional_ = true;
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"SHIFTED_FORCE","");
  std::__cxx11::string::_M_assign((string *)&(this->CutoffMethod).data_);
  (this->CutoffMethod).super_ParameterBase.defaultValue_ = true;
  (this->CutoffMethod).super_ParameterBase.empty_ = false;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"cutoffMethod","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_608;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_790,"electrostaticScreeningMethod","");
  std::__cxx11::string::_M_assign
            ((string *)&(this->ElectrostaticScreeningMethod).super_ParameterBase.keyword_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->ElectrostaticScreeningMethod).super_ParameterBase.optional_ = true;
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"DAMPED","");
  std::__cxx11::string::_M_assign((string *)&(this->ElectrostaticScreeningMethod).data_);
  (this->ElectrostaticScreeningMethod).super_ParameterBase.defaultValue_ = true;
  (this->ElectrostaticScreeningMethod).super_ParameterBase.empty_ = false;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_768,"electrostaticScreeningMethod","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_610;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"useSurfaceTerm","");
  std::__cxx11::string::_M_assign(local_618);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->UseSurfaceTerm).super_ParameterBase.optional_ = true;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"useSurfaceTerm","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_620;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"useSlabGeometry","");
  std::__cxx11::string::_M_assign(local_628);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->UseSlabGeometry).super_ParameterBase.optional_ = true;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"useSlabGeometry","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_630;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"dielectric","");
  std::__cxx11::string::_M_assign(local_638);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->Dielectric).super_ParameterBase.optional_ = true;
  (this->Dielectric).super_ParameterBase.defaultValue_ = true;
  (this->Dielectric).data_ = 80.0;
  (this->Dielectric).super_ParameterBase.empty_ = false;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"dielectric","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_640;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"compressDumpFile","");
  std::__cxx11::string::_M_assign(local_648);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->CompressDumpFile).super_ParameterBase.optional_ = true;
  (this->CompressDumpFile).super_ParameterBase.defaultValue_ = true;
  (this->CompressDumpFile).super_ParameterBase.empty_ = false;
  (this->CompressDumpFile).super_ParameterBase.field_0x2b = 0;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"compressDumpFile","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_650;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"printHeatFlux","");
  std::__cxx11::string::_M_assign(local_658);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->PrintHeatFlux).super_ParameterBase.optional_ = true;
  (this->PrintHeatFlux).super_ParameterBase.defaultValue_ = true;
  (this->PrintHeatFlux).super_ParameterBase.empty_ = false;
  (this->PrintHeatFlux).super_ParameterBase.field_0x2b = 0;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"printHeatFlux","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_660;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"outputForceVector","");
  std::__cxx11::string::_M_assign(local_668);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->OutputForceVector).super_ParameterBase.optional_ = true;
  (this->OutputForceVector).super_ParameterBase.defaultValue_ = true;
  (this->OutputForceVector).super_ParameterBase.empty_ = false;
  (this->OutputForceVector).super_ParameterBase.field_0x2b = 0;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"outputForceVector","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_670;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"outputParticlePotential","")
  ;
  std::__cxx11::string::_M_assign(local_678);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->OutputParticlePotential).super_ParameterBase.optional_ = true;
  (this->OutputParticlePotential).super_ParameterBase.defaultValue_ = true;
  (this->OutputParticlePotential).super_ParameterBase.empty_ = false;
  (this->OutputParticlePotential).super_ParameterBase.field_0x2b = 0;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"outputParticlePotential","")
  ;
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_680;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"outputElectricField","");
  std::__cxx11::string::_M_assign(local_688);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->OutputElectricField).super_ParameterBase.optional_ = true;
  (this->OutputElectricField).super_ParameterBase.defaultValue_ = true;
  (this->OutputElectricField).super_ParameterBase.empty_ = false;
  (this->OutputElectricField).super_ParameterBase.field_0x2b = 0;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"outputElectricField","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_690;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_790,"outputFluctuatingCharges","");
  std::__cxx11::string::_M_assign(local_698);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->OutputFluctuatingCharges).super_ParameterBase.optional_ = true;
  (this->OutputFluctuatingCharges).super_ParameterBase.defaultValue_ = true;
  (this->OutputFluctuatingCharges).super_ParameterBase.empty_ = false;
  (this->OutputFluctuatingCharges).super_ParameterBase.field_0x2b = 0;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_768,"outputFluctuatingCharges","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_6a0;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"outputSitePotential","");
  std::__cxx11::string::_M_assign(local_6a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->OutputSitePotential).super_ParameterBase.optional_ = true;
  (this->OutputSitePotential).super_ParameterBase.defaultValue_ = true;
  (this->OutputSitePotential).super_ParameterBase.empty_ = false;
  (this->OutputSitePotential).super_ParameterBase.field_0x2b = 0;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"outputSitePotential","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_6b0;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"outputDensity","");
  std::__cxx11::string::_M_assign(local_6b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->OutputDensity).super_ParameterBase.optional_ = true;
  (this->OutputDensity).super_ParameterBase.defaultValue_ = true;
  (this->OutputDensity).super_ParameterBase.empty_ = false;
  (this->OutputDensity).super_ParameterBase.field_0x2b = 0;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"outputDensity","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_6c0;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"skinThickness","");
  std::__cxx11::string::_M_assign(local_6c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->SkinThickness).super_ParameterBase.optional_ = true;
  (this->SkinThickness).super_ParameterBase.defaultValue_ = true;
  (this->SkinThickness).data_ = 1.0;
  (this->SkinThickness).super_ParameterBase.empty_ = false;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"skinThickness","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_6d0;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"statFileFormat","");
  std::__cxx11::string::_M_assign((string *)&(this->StatFileFormat).super_ParameterBase.keyword_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->StatFileFormat).super_ParameterBase.optional_ = true;
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_790,
             "TIME|TOTAL_ENERGY|POTENTIAL_ENERGY|KINETIC_ENERGY|TEMPERATURE|PRESSURE|VOLUME|CONSERVED_QUANTITY"
             ,"");
  std::__cxx11::string::_M_assign((string *)&(this->StatFileFormat).data_);
  (this->StatFileFormat).super_ParameterBase.defaultValue_ = true;
  (this->StatFileFormat).super_ParameterBase.empty_ = false;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"statFileFormat","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_6d8;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"statFilePrecision","");
  std::__cxx11::string::_M_assign(local_6e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->StatFilePrecision).super_ParameterBase.optional_ = true;
  (this->StatFilePrecision).super_ParameterBase.defaultValue_ = true;
  *(undefined4 *)&(this->StatFilePrecision).super_ParameterBase.field_0x2c = 8;
  (this->StatFilePrecision).super_ParameterBase.empty_ = false;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"statFilePrecision","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_6e8;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_790,"useSphericalBoundaryConditions","");
  std::__cxx11::string::_M_assign(local_6f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->UseSphericalBoundaryConditions).super_ParameterBase.optional_ = true;
  (this->UseSphericalBoundaryConditions).super_ParameterBase.defaultValue_ = true;
  (this->UseSphericalBoundaryConditions).super_ParameterBase.empty_ = false;
  (this->UseSphericalBoundaryConditions).super_ParameterBase.field_0x2b = 0;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_768,"useSphericalBoundaryConditions","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_6f8;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"accumulateBoxDipole","");
  std::__cxx11::string::_M_assign(local_700);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->AccumulateBoxDipole).super_ParameterBase.optional_ = true;
  (this->AccumulateBoxDipole).super_ParameterBase.defaultValue_ = true;
  (this->AccumulateBoxDipole).super_ParameterBase.empty_ = false;
  (this->AccumulateBoxDipole).super_ParameterBase.field_0x2b = 0;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"accumulateBoxDipole","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_708;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"accumulateBoxQuadrupole","")
  ;
  std::__cxx11::string::_M_assign(local_710);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->AccumulateBoxQuadrupole).super_ParameterBase.optional_ = true;
  (this->AccumulateBoxQuadrupole).super_ParameterBase.defaultValue_ = true;
  (this->AccumulateBoxQuadrupole).super_ParameterBase.empty_ = false;
  (this->AccumulateBoxQuadrupole).super_ParameterBase.field_0x2b = 0;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"accumulateBoxQuadrupole","")
  ;
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_718;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"useRestraints","");
  std::__cxx11::string::_M_assign(local_720);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->UseRestraints).super_ParameterBase.optional_ = true;
  (this->UseRestraints).super_ParameterBase.defaultValue_ = true;
  (this->UseRestraints).super_ParameterBase.empty_ = false;
  (this->UseRestraints).super_ParameterBase.field_0x2b = 0;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"useRestraints","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_728;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"Restraint_file","");
  std::__cxx11::string::_M_assign((string *)&(this->Restraint_file).super_ParameterBase.keyword_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->Restraint_file).super_ParameterBase.optional_ = true;
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"idealCrystal.in","");
  std::__cxx11::string::_M_assign((string *)&(this->Restraint_file).data_);
  (this->Restraint_file).super_ParameterBase.defaultValue_ = true;
  (this->Restraint_file).super_ParameterBase.empty_ = false;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"Restraint_file","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_730;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_790,"useThermodynamicIntegration","");
  std::__cxx11::string::_M_assign(local_738);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->UseThermodynamicIntegration).super_ParameterBase.optional_ = true;
  (this->UseThermodynamicIntegration).super_ParameterBase.defaultValue_ = true;
  (this->UseThermodynamicIntegration).super_ParameterBase.empty_ = false;
  (this->UseThermodynamicIntegration).super_ParameterBase.field_0x2b = 0;
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_768,"useThermodynamicIntegration","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_740;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"HULL_Method","");
  std::__cxx11::string::_M_assign((string *)&(this->HULL_Method).super_ParameterBase.keyword_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->HULL_Method).super_ParameterBase.optional_ = true;
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"Convex","");
  std::__cxx11::string::_M_assign((string *)&(this->HULL_Method).data_);
  (this->HULL_Method).super_ParameterBase.defaultValue_ = true;
  (this->HULL_Method).super_ParameterBase.empty_ = false;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"HULL_Method","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = local_748;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"privilegedAxis","");
  std::__cxx11::string::_M_assign((string *)&(this->PrivilegedAxis).super_ParameterBase.keyword_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  (this->PrivilegedAxis).super_ParameterBase.optional_ = true;
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"z","");
  std::__cxx11::string::_M_assign((string *)&(this->PrivilegedAxis).data_);
  (this->PrivilegedAxis).super_ParameterBase.defaultValue_ = true;
  (this->PrivilegedAxis).super_ParameterBase.empty_ = false;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  local_768 = &local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"privilegedAxis","");
  if (local_768 == &local_758) {
    local_790.first.field_2._8_8_ = local_758._8_8_;
    local_790.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_790.first._M_dataplus._M_p = (pointer)local_768;
  }
  local_790.first.field_2._M_allocated_capacity._1_7_ = local_758._M_allocated_capacity._1_7_;
  local_790.first.field_2._M_local_buf[0] = local_758._M_local_buf[0];
  local_790.first._M_string_length = local_760;
  local_760 = 0;
  local_758._M_local_buf[0] = '\0';
  local_790.second = &(this->PrivilegedAxis).super_ParameterBase;
  local_768 = &local_758;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  if (local_768 != &local_758) {
    operator_delete(local_768,
                    CONCAT71(local_758._M_allocated_capacity._1_7_,local_758._M_local_buf[0]) + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"nComponents","");
  this_01 = &(this->super_DataHolder).deprecatedKeywords_;
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this_01,&local_790.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"nZconstraints","");
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this_01,&local_790.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"initialConfig","");
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this_01,&local_790.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"thermIntDistSpringConst","")
  ;
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this_01,&local_790.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_790,"thermIntThetaSpringConst","");
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this_01,&local_790.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_790,"thermIntOmegaSpringConst","");
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this_01,&local_790.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"useSolidThermInt","");
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this_01,&local_790.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"useLiquidThermInt","");
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this_01,&local_790.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"minimizerMaxIter","");
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this_01,&local_790.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"minimizerWriteFreq","");
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this_01,&local_790.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"minimizerStepSize","");
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this_01,&local_790.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"minimizerFTol","");
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this_01,&local_790.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"minimizerGTol","");
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this_01,&local_790.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"minimizerLSTol","");
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this_01,&local_790.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"minimizerLSMaxIter","");
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this_01,&local_790.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"electricField","");
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this_01,&local_790.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"cutoffPolicy","");
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this_01,&local_790.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  local_790.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"beadSize","");
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this_01,&local_790.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_790.first._M_dataplus._M_p,
                    local_790.first.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

Globals::Globals() {
    flucQpars_     = new FluctuatingChargeParameters();
    rnemdPars_     = new RNEMD::RNEMDParameters();
    lightPars_     = new Perturbations::LightParameters();
    minimizerPars_ = new MinimizerParameters();

    DefineParameter(ForceField, "forceField");

    DefineOptionalParameter(TargetTemp, "targetTemp");
    DefineOptionalParameter(Ensemble, "ensemble");
    DefineOptionalParameter(Dt, "dt");
    DefineOptionalParameter(RunTime, "runTime");
    DefineOptionalParameter(FinalConfig, "finalConfig");
    DefineOptionalParameter(SampleTime, "sampleTime");
    DefineOptionalParameter(ResetTime, "resetTime");
    DefineOptionalParameter(StatusTime, "statusTime");
    DefineOptionalParameter(CutoffRadius, "cutoffRadius");
    DefineOptionalParameter(SwitchingRadius, "switchingRadius");
    DefineOptionalParameter(TempSet, "tempSet");
    DefineOptionalParameter(ThermalTime, "thermalTime");
    DefineOptionalParameter(TargetPressure, "targetPressure");
    DefineOptionalParameter(TauThermostat, "tauThermostat");
    DefineOptionalParameter(TauBarostat, "tauBarostat");
    DefineOptionalParameter(LangevinPistonDrag, "langevinPistonDrag");
    DefineOptionalParameter(ZconsTime, "zconsTime");
    DefineOptionalParameter(ZconsTol, "zconsTol");
    DefineOptionalParameter(ZconsForcePolicy, "zconsForcePolicy");
    DefineOptionalParameter(Seed, "seed");
    DefineOptionalParameter(ZconsGap, "zconsGap");
    DefineOptionalParameter(ZconsFixtime, "zconsFixtime");
    DefineOptionalParameter(ZconsUsingSMD, "zconsUsingSMD");
    DefineOptionalParameter(ThermodynamicIntegrationLambda,
                            "thermodynamicIntegrationLambda");
    DefineOptionalParameter(ThermodynamicIntegrationK,
                            "thermodynamicIntegrationK");
    DefineOptionalParameter(ForceFieldVariant, "forceFieldVariant");
    DefineOptionalParameter(ForceFieldFileName, "forceFieldFileName");
    DefineOptionalParameter(DampingAlpha, "dampingAlpha");
    DefineOptionalParameter(SurfaceTension, "surfaceTension");
    DefineOptionalParameter(PrintPressureTensor, "printPressureTensor");
    DefineOptionalParameter(PrintVirialTensor, "printVirialTensor");
    DefineOptionalParameter(ElectricField, "electricField");
    DefineOptionalParameter(UniformField, "uniformField");
    // magnetic field optional parameter added
    DefineOptionalParameter(MagneticField, "magneticField");
    DefineOptionalParameter(UniformGradientStrength, "uniformGradientStrength");
    DefineOptionalParameter(UniformGradientDirection1,
                            "uniformGradientDirection1");
    DefineOptionalParameter(UniformGradientDirection2,
                            "uniformGradientDirection2");
    // DefineOptionalParameter(PeriodicField, "periodicField");
    // DefineOptionalParameter(PeriodicFieldStrength, "periodicFieldStrength");

    DefineOptionalParameter(TaggedAtomPair, "taggedAtomPair");
    DefineOptionalParameter(PrintTaggedPairDistance, "printTaggedPairDistance");
    DefineOptionalParameter(SwitchingFunctionType, "switchingFunctionType");
    DefineOptionalParameter(HydroPropFile, "HydroPropFile");
    DefineOptionalParameter(Viscosity, "viscosity");
    DefineOptionalParameter(BeadSize, "beadSize");
    DefineOptionalParameter(FrozenBufferRadius, "frozenBufferRadius");
    DefineOptionalParameter(LangevinBufferRadius, "langevinBufferRadius");
    DefineOptionalParameter(NeighborListNeighbors, "NeighborListNeighbors");
    DefineOptionalParameter(UseMultipleTemperatureMethod,
                            "useMultipleTemperatureMethod");
    DefineOptionalParameter(ElectrostaticSummationMethod,
                            "electrostaticSummationMethod");
    DefineOptionalParameter(MTM_Ce, "MTM_Ce");
    DefineOptionalParameter(MTM_G, "MTM_G");
    DefineOptionalParameter(MTM_Io, "MTM_Io");
    DefineOptionalParameter(MTM_Sigma, "MTM_Sigma");
    DefineOptionalParameter(MTM_R, "MTM_R");
    DefineOptionalParameter(Alpha, "alpha");
    DefineOptionalParameter(ConstraintTime, "constraintTime");

    DefineOptionalParameter(PotentialSelection, "potentialSelection");

    DefineOptionalParameterWithDefaultValue(SkipPairLoop, "skipPairLoop",
                                            false);
    DefineOptionalParameterWithDefaultValue(
        UsePeriodicBoundaryConditions, "usePeriodicBoundaryConditions", true);
    DefineOptionalParameterWithDefaultValue(ConserveLinearMomentum,
                                            "conserveLinearMomentum", true);
    DefineOptionalParameterWithDefaultValue(ConserveAngularMomentum,
                                            "conserveAngularMomentum", true);
    DefineOptionalParameterWithDefaultValue(UseAtomicVirial, "useAtomicVirial",
                                            true);
    DefineOptionalParameterWithDefaultValue(UseLongRangeCorrections,
                                            "useLongRangeCorrections", true);
    DefineOptionalParameterWithDefaultValue(UseInitalTime, "useInitialTime",
                                            false);
    DefineOptionalParameterWithDefaultValue(
        UseIntialExtendedSystemState, "useInitialExtendedSystemState", false);
    DefineOptionalParameterWithDefaultValue(OrthoBoxTolerance,
                                            "orthoBoxTolerance", 1E-6);
    DefineOptionalParameterWithDefaultValue(CutoffMethod, "cutoffMethod",
                                            "SHIFTED_FORCE");
    DefineOptionalParameterWithDefaultValue(
        ElectrostaticScreeningMethod, "electrostaticScreeningMethod", "DAMPED");
    DefineOptionalParameter(UseSurfaceTerm, "useSurfaceTerm");
    DefineOptionalParameter(UseSlabGeometry, "useSlabGeometry");
    DefineOptionalParameterWithDefaultValue(Dielectric, "dielectric", 80.0);
    DefineOptionalParameterWithDefaultValue(CompressDumpFile,
                                            "compressDumpFile", false);
    DefineOptionalParameterWithDefaultValue(PrintHeatFlux, "printHeatFlux",
                                            false);
    DefineOptionalParameterWithDefaultValue(OutputForceVector,
                                            "outputForceVector", false);
    DefineOptionalParameterWithDefaultValue(OutputParticlePotential,
                                            "outputParticlePotential", false);
    DefineOptionalParameterWithDefaultValue(OutputElectricField,
                                            "outputElectricField", false);
    DefineOptionalParameterWithDefaultValue(OutputFluctuatingCharges,
                                            "outputFluctuatingCharges", false);
    DefineOptionalParameterWithDefaultValue(OutputSitePotential,
                                            "outputSitePotential", false);
    DefineOptionalParameterWithDefaultValue(OutputDensity, "outputDensity",
                                            false);
    DefineOptionalParameterWithDefaultValue(SkinThickness, "skinThickness",
                                            1.0);
    DefineOptionalParameterWithDefaultValue(
        StatFileFormat, "statFileFormat",
        "TIME|TOTAL_ENERGY|POTENTIAL_ENERGY|KINETIC_ENERGY|TEMPERATURE|"
        "PRESSURE|"
        "VOLUME|"
        "CONSERVED_QUANTITY");
    DefineOptionalParameterWithDefaultValue(StatFilePrecision,
                                            "statFilePrecision", 8);
    DefineOptionalParameterWithDefaultValue(UseSphericalBoundaryConditions,
                                            "useSphericalBoundaryConditions",
                                            false);
    DefineOptionalParameterWithDefaultValue(AccumulateBoxDipole,
                                            "accumulateBoxDipole", false);
    DefineOptionalParameterWithDefaultValue(AccumulateBoxQuadrupole,
                                            "accumulateBoxQuadrupole", false);
    DefineOptionalParameterWithDefaultValue(UseRestraints, "useRestraints",
                                            false);
    DefineOptionalParameterWithDefaultValue(Restraint_file, "Restraint_file",
                                            "idealCrystal.in");
    DefineOptionalParameterWithDefaultValue(
        UseThermodynamicIntegration, "useThermodynamicIntegration", false);
    DefineOptionalParameterWithDefaultValue(HULL_Method, "HULL_Method",
                                            "Convex");

    DefineOptionalParameterWithDefaultValue(PrivilegedAxis, "privilegedAxis",
                                            "z");

    deprecatedKeywords_.insert("nComponents");
    deprecatedKeywords_.insert("nZconstraints");
    deprecatedKeywords_.insert("initialConfig");
    deprecatedKeywords_.insert("thermIntDistSpringConst");
    deprecatedKeywords_.insert("thermIntThetaSpringConst");
    deprecatedKeywords_.insert("thermIntOmegaSpringConst");
    deprecatedKeywords_.insert("useSolidThermInt");
    deprecatedKeywords_.insert("useLiquidThermInt");
    deprecatedKeywords_.insert("minimizerMaxIter");
    deprecatedKeywords_.insert("minimizerWriteFreq");
    deprecatedKeywords_.insert("minimizerStepSize");
    deprecatedKeywords_.insert("minimizerFTol");
    deprecatedKeywords_.insert("minimizerGTol");
    deprecatedKeywords_.insert("minimizerLSTol");
    deprecatedKeywords_.insert("minimizerLSMaxIter");
    deprecatedKeywords_.insert("electricField");
    deprecatedKeywords_.insert("cutoffPolicy");
    deprecatedKeywords_.insert("beadSize");
  }